

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiMBIntersector1<4>::
     occluded_n<embree::avx512::OrientedCurve1Intersector1<embree::BezierCurveT,7,8>,embree::avx512::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  Primitive PVar5;
  uint uVar6;
  Geometry *pGVar7;
  __int_type_conflict _Var8;
  long lVar9;
  long lVar10;
  long lVar11;
  RTCFilterFunctionN p_Var12;
  bool bVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  bool bVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  long lVar29;
  uint uVar30;
  long lVar31;
  uint uVar32;
  bool bVar33;
  ulong uVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 in_YmmResult [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar83 [32];
  undefined1 auVar85 [32];
  undefined1 auVar87 [32];
  undefined1 auVar89 [32];
  int iVar91;
  undefined4 uVar92;
  vint4 bi_2;
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  vint4 bi_1;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  vint4 bi;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [32];
  vfloat4 a0;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  vint4 ai_2;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  vint4 ai_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  vint4 ai;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  float fVar164;
  float fVar178;
  float fVar179;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  float fVar180;
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  float fVar201;
  float fVar213;
  float fVar214;
  vfloat4 a0_3;
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  float fVar215;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  float fVar216;
  float fVar217;
  float fVar218;
  vfloat4 b0_2;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  vfloat4 a0_4;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar243 [16];
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  __m128 a_2;
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  undefined1 auVar250 [64];
  undefined1 auVar251 [64];
  undefined1 auVar252 [64];
  undefined1 in_ZMM19 [64];
  undefined1 auVar253 [64];
  undefined1 auVar254 [64];
  undefined1 auVar255 [64];
  undefined1 auVar256 [64];
  int iVar257;
  undefined1 in_ZMM30 [64];
  undefined1 auVar258 [64];
  undefined1 in_ZMM31 [64];
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_379;
  int local_32c;
  undefined1 local_328 [16];
  undefined1 local_318 [16];
  undefined1 local_308 [16];
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [16];
  long local_2d0;
  ulong local_2c8;
  Primitive *local_2c0;
  RTCFilterFunctionNArguments local_2b8;
  undefined1 local_288 [8];
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float fStack_26c;
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  undefined1 local_218 [16];
  undefined1 local_208 [16];
  undefined1 local_1f8 [8];
  float fStack_1f0;
  float fStack_1ec;
  undefined1 local_1e8 [8];
  float fStack_1e0;
  float fStack_1dc;
  undefined1 local_1d8 [8];
  float fStack_1d0;
  float fStack_1cc;
  undefined1 local_1c8 [8];
  float fStack_1c0;
  float fStack_1bc;
  undefined1 local_1b8 [8];
  float fStack_1b0;
  float fStack_1ac;
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint auStack_168 [4];
  undefined8 local_158;
  undefined4 local_150;
  undefined8 local_14c;
  undefined4 local_144;
  uint local_140;
  uint local_13c;
  uint local_138;
  undefined1 local_128 [8];
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  uint uStack_b8;
  float afStack_b4 [7];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar25;
  undefined1 auVar82 [32];
  undefined1 auVar84 [32];
  undefined1 auVar86 [32];
  undefined1 auVar88 [32];
  undefined1 auVar90 [32];
  undefined1 auVar239 [32];
  
  PVar5 = prim[1];
  uVar24 = (ulong)(byte)PVar5;
  lVar31 = uVar24 * 0x25;
  fVar218 = *(float *)(prim + lVar31 + 0x12);
  auVar40 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + lVar31 + 6));
  auVar53._0_4_ = fVar218 * (ray->dir).field_0.m128[0];
  auVar53._4_4_ = fVar218 * (ray->dir).field_0.m128[1];
  auVar53._8_4_ = fVar218 * (ray->dir).field_0.m128[2];
  auVar53._12_4_ = fVar218 * (ray->dir).field_0.m128[3];
  auVar39 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 4 + 6)));
  auVar126._0_4_ = fVar218 * auVar40._0_4_;
  auVar126._4_4_ = fVar218 * auVar40._4_4_;
  auVar126._8_4_ = fVar218 * auVar40._8_4_;
  auVar126._12_4_ = fVar218 * auVar40._12_4_;
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 5 + 6)));
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar36 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 6 + 6)));
  auVar47 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0xf + 6)));
  auVar36 = vcvtdq2ps_avx(auVar36);
  auVar47 = vcvtdq2ps_avx(auVar47);
  auVar52 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + 6)));
  auVar52 = vcvtdq2ps_avx(auVar52);
  auVar37 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar5 * 0x10 + uVar24 + 6)));
  auVar37 = vcvtdq2ps_avx(auVar37);
  auVar50 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1a + 6)));
  auVar50 = vcvtdq2ps_avx(auVar50);
  auVar51 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1b + 6)));
  auVar51 = vcvtdq2ps_avx(auVar51);
  auVar38 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar24 * 0x1c + 6)));
  auVar38 = vcvtdq2ps_avx(auVar38);
  auVar136._4_4_ = auVar53._0_4_;
  auVar136._0_4_ = auVar53._0_4_;
  auVar136._8_4_ = auVar53._0_4_;
  auVar136._12_4_ = auVar53._0_4_;
  auVar54 = vshufps_avx(auVar53,auVar53,0x55);
  auVar55 = vshufps_avx(auVar53,auVar53,0xaa);
  fVar218 = auVar55._0_4_;
  auVar107._0_4_ = fVar218 * auVar36._0_4_;
  fVar201 = auVar55._4_4_;
  auVar107._4_4_ = fVar201 * auVar36._4_4_;
  fVar213 = auVar55._8_4_;
  auVar107._8_4_ = fVar213 * auVar36._8_4_;
  fVar214 = auVar55._12_4_;
  auVar107._12_4_ = fVar214 * auVar36._12_4_;
  auVar48._0_4_ = auVar37._0_4_ * fVar218;
  auVar48._4_4_ = auVar37._4_4_ * fVar201;
  auVar48._8_4_ = auVar37._8_4_ * fVar213;
  auVar48._12_4_ = auVar37._12_4_ * fVar214;
  auVar42._0_4_ = auVar38._0_4_ * fVar218;
  auVar42._4_4_ = auVar38._4_4_ * fVar201;
  auVar42._8_4_ = auVar38._8_4_ * fVar213;
  auVar42._12_4_ = auVar38._12_4_ * fVar214;
  auVar55 = vfmadd231ps_fma(auVar107,auVar54,auVar40);
  auVar56 = vfmadd231ps_fma(auVar48,auVar54,auVar52);
  auVar54 = vfmadd231ps_fma(auVar42,auVar51,auVar54);
  auVar55 = vfmadd231ps_fma(auVar55,auVar136,auVar39);
  auVar56 = vfmadd231ps_fma(auVar56,auVar136,auVar47);
  auVar58 = vfmadd231ps_fma(auVar54,auVar50,auVar136);
  auVar240._4_4_ = auVar126._0_4_;
  auVar240._0_4_ = auVar126._0_4_;
  auVar240._8_4_ = auVar126._0_4_;
  auVar240._12_4_ = auVar126._0_4_;
  auVar54 = vshufps_avx(auVar126,auVar126,0x55);
  auVar77._16_16_ = in_YmmResult._16_16_;
  auVar35 = vshufps_avx512vl(auVar126,auVar126,0xaa);
  auVar36 = vmulps_avx512vl(auVar35,auVar36);
  auVar37 = vmulps_avx512vl(auVar35,auVar37);
  auVar38 = vmulps_avx512vl(auVar35,auVar38);
  auVar40 = vfmadd231ps_fma(auVar36,auVar54,auVar40);
  auVar36 = vfmadd231ps_fma(auVar37,auVar54,auVar52);
  auVar52 = vfmadd231ps_fma(auVar38,auVar54,auVar51);
  auVar41 = vfmadd231ps_fma(auVar40,auVar240,auVar39);
  auVar42 = vfmadd231ps_fma(auVar36,auVar240,auVar47);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar254 = ZEXT1664(auVar39);
  auVar43 = vfmadd231ps_fma(auVar52,auVar240,auVar50);
  auVar40 = vandps_avx512vl(auVar55,auVar39);
  auVar165._8_4_ = 0x219392ef;
  auVar165._0_8_ = 0x219392ef219392ef;
  auVar165._12_4_ = 0x219392ef;
  uVar34 = vcmpps_avx512vl(auVar40,auVar165,1);
  bVar33 = (bool)((byte)uVar34 & 1);
  auVar44._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar55._0_4_;
  bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar44._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar55._4_4_;
  bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar44._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar55._8_4_;
  bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar44._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar55._12_4_;
  auVar40 = vandps_avx512vl(auVar56,auVar39);
  uVar34 = vcmpps_avx512vl(auVar40,auVar165,1);
  bVar33 = (bool)((byte)uVar34 & 1);
  auVar45._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar56._0_4_;
  bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar45._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar56._4_4_;
  bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar45._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar56._8_4_;
  bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar45._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar56._12_4_;
  auVar39 = vandps_avx512vl(auVar58,auVar39);
  uVar34 = vcmpps_avx512vl(auVar39,auVar165,1);
  bVar33 = (bool)((byte)uVar34 & 1);
  auVar46._0_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar58._0_4_;
  bVar33 = (bool)((byte)(uVar34 >> 1) & 1);
  auVar46._4_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar58._4_4_;
  bVar33 = (bool)((byte)(uVar34 >> 2) & 1);
  auVar46._8_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar58._8_4_;
  bVar33 = (bool)((byte)(uVar34 >> 3) & 1);
  auVar46._12_4_ = (uint)bVar33 * 0x219392ef | (uint)!bVar33 * auVar58._12_4_;
  auVar40 = vrcp14ps_avx512vl(auVar44);
  auVar166._8_4_ = 0x3f800000;
  auVar166._0_8_ = &DAT_3f8000003f800000;
  auVar166._12_4_ = 0x3f800000;
  auVar39 = vfnmadd213ps_fma(auVar44,auVar40,auVar166);
  auVar58 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar45);
  auVar39 = vfnmadd213ps_fma(auVar45,auVar40,auVar166);
  auVar35 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  auVar40 = vrcp14ps_avx512vl(auVar46);
  auVar39 = vfnmadd213ps_fma(auVar46,auVar40,auVar166);
  auVar57 = vfmadd132ps_fma(auVar39,auVar40,auVar40);
  fVar218 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar31 + 0x16)) *
            *(float *)(prim + lVar31 + 0x1a);
  auVar150._4_4_ = fVar218;
  auVar150._0_4_ = fVar218;
  auVar150._8_4_ = fVar218;
  auVar150._12_4_ = fVar218;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = *(ulong *)(prim + uVar24 * 7 + 6);
  auVar39 = vpmovsxwd_avx(auVar39);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar40._8_8_ = 0;
  auVar40._0_8_ = *(ulong *)(prim + uVar24 * 0xb + 6);
  auVar40 = vpmovsxwd_avx(auVar40);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar47 = vsubps_avx(auVar40,auVar39);
  auVar36._8_8_ = 0;
  auVar36._0_8_ = *(ulong *)(prim + uVar24 * 9 + 6);
  auVar40 = vpmovsxwd_avx(auVar36);
  auVar36 = vfmadd213ps_fma(auVar47,auVar150,auVar39);
  auVar39 = vcvtdq2ps_avx(auVar40);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar24 * 0xd + 6);
  auVar40 = vpmovsxwd_avx(auVar47);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar47 = vfmadd213ps_fma(auVar40,auVar150,auVar39);
  auVar52._8_8_ = 0;
  auVar52._0_8_ = *(ulong *)(prim + uVar24 * 0x12 + 6);
  auVar39 = vpmovsxwd_avx(auVar52);
  auVar39 = vcvtdq2ps_avx(auVar39);
  uVar34 = (ulong)(uint)((int)(uVar24 * 5) << 2);
  auVar37._8_8_ = 0;
  auVar37._0_8_ = *(ulong *)(prim + uVar24 * 2 + uVar34 + 6);
  auVar40 = vpmovsxwd_avx(auVar37);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar52 = vfmadd213ps_fma(auVar40,auVar150,auVar39);
  auVar50._8_8_ = 0;
  auVar50._0_8_ = *(ulong *)(prim + uVar34 + 6);
  auVar39 = vpmovsxwd_avx(auVar50);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar51._8_8_ = 0;
  auVar51._0_8_ = *(ulong *)(prim + uVar24 * 0x18 + 6);
  auVar40 = vpmovsxwd_avx(auVar51);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar37 = vfmadd213ps_fma(auVar40,auVar150,auVar39);
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar24 * 0x1d + 6);
  auVar39 = vpmovsxwd_avx(auVar38);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar54._8_8_ = 0;
  auVar54._0_8_ = *(ulong *)(prim + uVar24 + (ulong)(byte)PVar5 * 0x20 + 6);
  auVar40 = vpmovsxwd_avx(auVar54);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar50 = vfmadd213ps_fma(auVar40,auVar150,auVar39);
  auVar55._8_8_ = 0;
  auVar55._0_8_ = *(ulong *)(prim + ((ulong)(byte)PVar5 * 0x20 - uVar24) + 6);
  auVar39 = vpmovsxwd_avx(auVar55);
  auVar39 = vcvtdq2ps_avx(auVar39);
  auVar56._8_8_ = 0;
  auVar56._0_8_ = *(ulong *)(prim + uVar24 * 0x23 + 6);
  auVar40 = vpmovsxwd_avx(auVar56);
  auVar40 = vcvtdq2ps_avx(auVar40);
  auVar40 = vsubps_avx(auVar40,auVar39);
  auVar40 = vfmadd213ps_fma(auVar40,auVar150,auVar39);
  auVar39 = vsubps_avx(auVar36,auVar41);
  auVar151._0_4_ = auVar58._0_4_ * auVar39._0_4_;
  auVar151._4_4_ = auVar58._4_4_ * auVar39._4_4_;
  auVar151._8_4_ = auVar58._8_4_ * auVar39._8_4_;
  auVar151._12_4_ = auVar58._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar47,auVar41);
  auVar108._0_4_ = auVar58._0_4_ * auVar39._0_4_;
  auVar108._4_4_ = auVar58._4_4_ * auVar39._4_4_;
  auVar108._8_4_ = auVar58._8_4_ * auVar39._8_4_;
  auVar108._12_4_ = auVar58._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar52,auVar42);
  auVar137._0_4_ = auVar35._0_4_ * auVar39._0_4_;
  auVar137._4_4_ = auVar35._4_4_ * auVar39._4_4_;
  auVar137._8_4_ = auVar35._8_4_ * auVar39._8_4_;
  auVar137._12_4_ = auVar35._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar37,auVar42);
  auVar49._0_4_ = auVar35._0_4_ * auVar39._0_4_;
  auVar49._4_4_ = auVar35._4_4_ * auVar39._4_4_;
  auVar49._8_4_ = auVar35._8_4_ * auVar39._8_4_;
  auVar49._12_4_ = auVar35._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar50,auVar43);
  auVar127._0_4_ = auVar57._0_4_ * auVar39._0_4_;
  auVar127._4_4_ = auVar57._4_4_ * auVar39._4_4_;
  auVar127._8_4_ = auVar57._8_4_ * auVar39._8_4_;
  auVar127._12_4_ = auVar57._12_4_ * auVar39._12_4_;
  auVar39 = vsubps_avx(auVar40,auVar43);
  auVar43._0_4_ = auVar57._0_4_ * auVar39._0_4_;
  auVar43._4_4_ = auVar57._4_4_ * auVar39._4_4_;
  auVar43._8_4_ = auVar57._8_4_ * auVar39._8_4_;
  auVar43._12_4_ = auVar57._12_4_ * auVar39._12_4_;
  auVar39 = vpminsd_avx(auVar151,auVar108);
  auVar40 = vpminsd_avx(auVar137,auVar49);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar40 = vpminsd_avx(auVar127,auVar43);
  uVar92 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar58._4_4_ = uVar92;
  auVar58._0_4_ = uVar92;
  auVar58._8_4_ = uVar92;
  auVar58._12_4_ = uVar92;
  auVar40 = vmaxps_avx512vl(auVar40,auVar58);
  auVar39 = vmaxps_avx(auVar39,auVar40);
  auVar35._8_4_ = 0x3f7ffffa;
  auVar35._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar35._12_4_ = 0x3f7ffffa;
  local_e8 = vmulps_avx512vl(auVar39,auVar35);
  auVar39 = vpmaxsd_avx(auVar151,auVar108);
  auVar40 = vpmaxsd_avx(auVar137,auVar49);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar40 = vpmaxsd_avx(auVar127,auVar43);
  fVar218 = ray->tfar;
  auVar57._4_4_ = fVar218;
  auVar57._0_4_ = fVar218;
  auVar57._8_4_ = fVar218;
  auVar57._12_4_ = fVar218;
  auVar40 = vminps_avx512vl(auVar40,auVar57);
  auVar39 = vminps_avx(auVar39,auVar40);
  auVar41._8_4_ = 0x3f800003;
  auVar41._0_8_ = 0x3f8000033f800003;
  auVar41._12_4_ = 0x3f800003;
  auVar39 = vmulps_avx512vl(auVar39,auVar41);
  auVar40 = vpbroadcastd_avx512vl();
  uVar14 = vcmpps_avx512vl(local_e8,auVar39,2);
  uVar34 = vpcmpgtd_avx512vl(auVar40,_DAT_01ff0cf0);
  uVar34 = ((byte)uVar14 & 0xf) & uVar34;
  bVar33 = (char)uVar34 == '\0';
  local_379 = !bVar33;
  if (bVar33) {
    return local_379;
  }
  auVar39 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar258 = ZEXT1664(auVar39);
  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar253 = ZEXT1664(auVar39);
  local_2c0 = prim;
LAB_01c1d999:
  lVar31 = 0;
  for (uVar24 = uVar34; (uVar24 & 1) == 0; uVar24 = uVar24 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar32 = *(uint *)(local_2c0 + 2);
  pGVar7 = (context->scene->geometries).items[uVar32].ptr;
  fVar218 = (pGVar7->time_range).lower;
  fVar218 = pGVar7->fnumTimeSegments *
            (((ray->dir).field_0.m128[3] - fVar218) / ((pGVar7->time_range).upper - fVar218));
  auVar39 = vroundss_avx(ZEXT416((uint)fVar218),ZEXT416((uint)fVar218),9);
  local_2c8 = (ulong)*(uint *)(local_2c0 + lVar31 * 4 + 6);
  auVar40 = vaddss_avx512f(ZEXT416((uint)pGVar7->fnumTimeSegments),SUB6416(ZEXT464(0xbf800000),0));
  auVar39 = vminss_avx(auVar39,auVar40);
  auVar41 = vmaxss_avx512f(auVar258._0_16_,auVar39);
  uVar24 = (ulong)*(uint *)(*(long *)&pGVar7->field_0x58 +
                           local_2c8 *
                           pGVar7[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var8 = pGVar7[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar28 = (long)(int)auVar41._0_4_ * 0x38;
  lVar9 = *(long *)(_Var8 + lVar28);
  lVar10 = *(long *)(_Var8 + 0x10 + lVar28);
  auVar39 = *(undefined1 (*) [16])(lVar9 + lVar10 * uVar24);
  lVar31 = uVar24 + 1;
  auVar40 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar31);
  lVar29 = uVar24 + 2;
  auVar36 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar29);
  lVar1 = uVar24 + 3;
  auVar47 = *(undefined1 (*) [16])(lVar9 + lVar10 * lVar1);
  lVar9 = *(long *)&pGVar7[4].fnumTimeSegments;
  lVar10 = *(long *)(lVar9 + lVar28);
  lVar11 = *(long *)(lVar9 + 0x10 + lVar28);
  auVar52 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar24);
  auVar37 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
  auVar50 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar29);
  auVar51 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)(_Var8 + 0x38 + lVar28);
  lVar11 = *(long *)(_Var8 + 0x48 + lVar28);
  auVar38 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar24);
  auVar54 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar31);
  auVar55 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar29);
  auVar56 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar10 = *(long *)(lVar9 + 0x38 + lVar28);
  lVar9 = *(long *)(lVar9 + 0x48 + lVar28);
  auVar58 = *(undefined1 (*) [16])(lVar10 + uVar24 * lVar9);
  auVar35 = *(undefined1 (*) [16])(lVar10 + lVar31 * lVar9);
  auVar57 = *(undefined1 (*) [16])(lVar10 + lVar29 * lVar9);
  auVar41 = vsubss_avx512f(ZEXT416((uint)fVar218),auVar41);
  auVar73._0_16_ = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar42 = vmulps_avx512vl(auVar47,auVar73._0_16_);
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar36,auVar73._0_16_);
  auVar43 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar40,auVar42);
  auVar43 = vaddps_avx512vl(auVar39,auVar43);
  auVar107 = auVar253._0_16_;
  auVar42 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar107);
  auVar42 = vfnmadd231ps_avx512vl(auVar42,auVar39,auVar107);
  auVar44 = vmulps_avx512vl(auVar51,auVar73._0_16_);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar50,auVar73._0_16_);
  auVar45 = vxorps_avx512vl(in_ZMM19._0_16_,in_ZMM19._0_16_);
  auVar45 = vfmadd213ps_avx512vl(auVar45,auVar37,auVar44);
  auVar46 = vaddps_avx512vl(auVar52,auVar45);
  auVar44 = vfmadd231ps_avx512vl(auVar44,auVar37,auVar107);
  auVar44 = vfnmadd231ps_avx512vl(auVar44,auVar52,auVar107);
  auVar45 = vxorps_avx512vl(auVar45,auVar45);
  auVar45 = vfmadd213ps_avx512vl(auVar45,auVar36,auVar47);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar40,auVar73._0_16_);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar39,auVar73._0_16_);
  auVar47 = vmulps_avx512vl(auVar47,auVar107);
  auVar36 = vfnmadd231ps_avx512vl(auVar47,auVar107,auVar36);
  auVar40 = vfmadd231ps_avx512vl(auVar36,auVar73._0_16_,auVar40);
  auVar48 = vfnmadd231ps_avx512vl(auVar40,auVar73._0_16_,auVar39);
  auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar50,auVar51);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar37,auVar73._0_16_);
  auVar49 = vfmadd231ps_avx512vl(auVar39,auVar52,auVar73._0_16_);
  auVar39 = vmulps_avx512vl(auVar51,auVar107);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar107,auVar50);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar73._0_16_,auVar37);
  auVar37 = vfnmadd231ps_avx512vl(auVar39,auVar73._0_16_,auVar52);
  auVar40 = vshufps_avx512vl(auVar42,auVar42,0xc9);
  auVar39 = vshufps_avx512vl(auVar46,auVar46,0xc9);
  auVar39 = vmulps_avx512vl(auVar42,auVar39);
  auVar39 = vfmsub231ps_avx512vl(auVar39,auVar40,auVar46);
  auVar36 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar39 = vmulps_avx512vl(auVar42,auVar39);
  auVar39 = vfmsub231ps_fma(auVar39,auVar40,auVar44);
  auVar47 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar40 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar152._0_4_ = auVar48._0_4_ * auVar40._0_4_;
  auVar152._4_4_ = auVar48._4_4_ * auVar40._4_4_;
  auVar152._8_4_ = auVar48._8_4_ * auVar40._8_4_;
  auVar152._12_4_ = auVar48._12_4_ * auVar40._12_4_;
  auVar40 = vfmsub231ps_fma(auVar152,auVar39,auVar49);
  auVar52 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar40 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar153._0_4_ = auVar48._0_4_ * auVar40._0_4_;
  auVar153._4_4_ = auVar48._4_4_ * auVar40._4_4_;
  auVar153._8_4_ = auVar48._8_4_ * auVar40._8_4_;
  auVar153._12_4_ = auVar48._12_4_ * auVar40._12_4_;
  auVar39 = vfmsub231ps_fma(auVar153,auVar39,auVar37);
  auVar37 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vdpps_avx(auVar36,auVar36,0x7f);
  auVar73._16_16_ = auVar77._16_16_;
  auVar59._4_28_ = auVar73._4_28_;
  auVar59._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar73._0_16_,auVar59._0_16_);
  auVar50 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar51 = vmulss_avx512f(auVar51,auVar40);
  auVar40 = vmulss_avx512f(auVar51,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
  fVar213 = auVar50._0_4_ - auVar40._0_4_;
  auVar181._4_4_ = fVar213;
  auVar181._0_4_ = fVar213;
  auVar181._8_4_ = fVar213;
  auVar181._12_4_ = fVar213;
  auVar40 = vdpps_avx(auVar36,auVar47,0x7f);
  auVar50 = vmulps_avx512vl(auVar36,auVar181);
  auVar51 = vbroadcastss_avx512vl(auVar39);
  auVar47 = vmulps_avx512vl(auVar51,auVar47);
  fVar218 = auVar40._0_4_;
  auVar138._0_4_ = fVar218 * auVar36._0_4_;
  auVar138._4_4_ = fVar218 * auVar36._4_4_;
  auVar138._8_4_ = fVar218 * auVar36._8_4_;
  auVar138._12_4_ = fVar218 * auVar36._12_4_;
  auVar36 = vsubps_avx(auVar47,auVar138);
  auVar40 = vrcp14ss_avx512f(auVar73._0_16_,auVar59._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar40,ZEXT416(0x40000000));
  fVar218 = auVar40._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar75._16_16_ = auVar77._16_16_;
  auVar75._0_16_ = auVar73._0_16_;
  auVar76._4_28_ = auVar75._4_28_;
  auVar76._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar73._0_16_,auVar76._0_16_);
  auVar47 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar51 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  fVar201 = auVar40._0_4_;
  fVar214 = auVar47._0_4_ - auVar51._0_4_ * fVar201 * fVar201 * fVar201;
  auVar182._0_4_ = auVar52._0_4_ * fVar214;
  auVar182._4_4_ = auVar52._4_4_ * fVar214;
  auVar182._8_4_ = auVar52._8_4_ * fVar214;
  auVar182._12_4_ = auVar52._12_4_ * fVar214;
  auVar40 = vdpps_avx(auVar52,auVar37,0x7f);
  auVar47 = vbroadcastss_avx512vl(auVar39);
  auVar47 = vmulps_avx512vl(auVar47,auVar37);
  fVar201 = auVar40._0_4_;
  auVar97._0_4_ = fVar201 * auVar52._0_4_;
  auVar97._4_4_ = fVar201 * auVar52._4_4_;
  auVar97._8_4_ = fVar201 * auVar52._8_4_;
  auVar97._12_4_ = fVar201 * auVar52._12_4_;
  auVar40 = vsubps_avx(auVar47,auVar97);
  auVar47 = vrcp14ss_avx512f(auVar73._0_16_,auVar76._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar47,ZEXT416(0x40000000));
  fVar201 = auVar47._0_4_ * auVar39._0_4_;
  auVar39 = vshufps_avx512vl(auVar43,auVar43,0xff);
  auVar47 = vmulps_avx512vl(auVar39,auVar50);
  auVar44 = vsubps_avx512vl(auVar43,auVar47);
  auVar52 = vshufps_avx512vl(auVar42,auVar42,0xff);
  auVar52 = vmulps_avx512vl(auVar52,auVar50);
  auVar128._0_4_ = auVar52._0_4_ + auVar39._0_4_ * fVar213 * fVar218 * auVar36._0_4_;
  auVar128._4_4_ = auVar52._4_4_ + auVar39._4_4_ * fVar213 * fVar218 * auVar36._4_4_;
  auVar128._8_4_ = auVar52._8_4_ + auVar39._8_4_ * fVar213 * fVar218 * auVar36._8_4_;
  auVar128._12_4_ = auVar52._12_4_ + auVar39._12_4_ * fVar213 * fVar218 * auVar36._12_4_;
  auVar36 = vsubps_avx512vl(auVar42,auVar128);
  auVar43 = vaddps_avx512vl(auVar43,auVar47);
  auVar47 = vaddps_avx512vl(auVar42,auVar128);
  auVar39 = vshufps_avx512vl(auVar45,auVar45,0xff);
  auVar52 = vmulps_avx512vl(auVar39,auVar182);
  auVar42 = vsubps_avx512vl(auVar45,auVar52);
  auVar37 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar50 = vmulps_avx512vl(auVar37,auVar182);
  auVar183._0_4_ = auVar50._0_4_ + auVar39._0_4_ * fVar214 * auVar40._0_4_ * fVar201;
  auVar183._4_4_ = auVar50._4_4_ + auVar39._4_4_ * fVar214 * auVar40._4_4_ * fVar201;
  auVar183._8_4_ = auVar50._8_4_ + auVar39._8_4_ * fVar214 * auVar40._8_4_ * fVar201;
  auVar183._12_4_ = auVar50._12_4_ + auVar39._12_4_ * fVar214 * auVar40._12_4_ * fVar201;
  auVar39 = vsubps_avx(auVar48,auVar183);
  auVar45 = vaddps_avx512vl(auVar45,auVar52);
  auVar40 = vaddps_avx512vl(auVar48,auVar183);
  auVar93._8_4_ = 0x3eaaaaab;
  auVar93._0_8_ = 0x3eaaaaab3eaaaaab;
  auVar93._12_4_ = 0x3eaaaaab;
  auVar167._0_4_ = auVar44._0_4_ + auVar36._0_4_ * 0.33333334;
  auVar167._4_4_ = auVar44._4_4_ + auVar36._4_4_ * 0.33333334;
  auVar167._8_4_ = auVar44._8_4_ + auVar36._8_4_ * 0.33333334;
  auVar167._12_4_ = auVar44._12_4_ + auVar36._12_4_ * 0.33333334;
  auVar154._0_4_ = auVar39._0_4_ * 0.33333334;
  auVar154._4_4_ = auVar39._4_4_ * 0.33333334;
  auVar154._8_4_ = auVar39._8_4_ * 0.33333334;
  auVar154._12_4_ = auVar39._12_4_ * 0.33333334;
  auVar50 = vsubps_avx(auVar42,auVar154);
  auVar139._0_4_ = auVar47._0_4_ * 0.33333334;
  auVar139._4_4_ = auVar47._4_4_ * 0.33333334;
  auVar139._8_4_ = auVar47._8_4_ * 0.33333334;
  auVar139._12_4_ = auVar47._12_4_ * 0.33333334;
  auVar46 = vaddps_avx512vl(auVar43,auVar139);
  auVar39 = vmulps_avx512vl(auVar40,auVar93);
  auVar51 = vsubps_avx(auVar45,auVar39);
  auVar39 = *(undefined1 (*) [16])(lVar10 + lVar9 * lVar1);
  auVar36 = vmulps_avx512vl(auVar56,auVar73._0_16_);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar55,auVar73._0_16_);
  auVar40 = vxorps_avx512vl(auVar40,auVar40);
  auVar40 = vfmadd213ps_avx512vl(auVar40,auVar54,auVar36);
  auVar48 = vaddps_avx512vl(auVar38,auVar40);
  auVar40 = vfmadd231ps_avx512vl(auVar36,auVar54,auVar107);
  auVar49 = vfnmadd231ps_avx512vl(auVar40,auVar38,auVar107);
  auVar40 = vmulps_avx512vl(auVar39,auVar73._0_16_);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar57,auVar73._0_16_);
  auVar36 = vxorps_avx512vl(auVar37,auVar37);
  auVar36 = vfmadd213ps_avx512vl(auVar36,auVar35,auVar40);
  auVar47 = vaddps_avx512vl(auVar58,auVar36);
  auVar40 = vfmadd231ps_avx512vl(auVar40,auVar35,auVar107);
  auVar40 = vfnmadd231ps_avx512vl(auVar40,auVar58,auVar107);
  auVar36 = vxorps_avx512vl(auVar36,auVar36);
  auVar36 = vfmadd213ps_avx512vl(auVar36,auVar55,auVar56);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar54,auVar73._0_16_);
  auVar53 = vfmadd231ps_avx512vl(auVar36,auVar38,auVar73._0_16_);
  auVar36 = vmulps_avx512vl(auVar56,auVar107);
  auVar36 = vfnmadd231ps_avx512vl(auVar36,auVar107,auVar55);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar73._0_16_,auVar54);
  auVar38 = vfnmadd231ps_avx512vl(auVar36,auVar73._0_16_,auVar38);
  auVar36 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar57,auVar39);
  auVar36 = vfmadd231ps_avx512vl(auVar36,auVar35,auVar73._0_16_);
  auVar52 = vfmadd231ps_avx512vl(auVar36,auVar58,auVar73._0_16_);
  auVar39 = vmulps_avx512vl(auVar39,auVar107);
  auVar39 = vfnmadd231ps_avx512vl(auVar39,auVar107,auVar57);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar73._0_16_,auVar35);
  auVar37 = vfnmadd231ps_avx512vl(auVar39,auVar73._0_16_,auVar58);
  auVar39 = vshufps_avx(auVar49,auVar49,0xc9);
  auVar36 = vshufps_avx512vl(auVar47,auVar47,0xc9);
  fVar213 = auVar49._0_4_;
  auVar233._0_4_ = fVar213 * auVar36._0_4_;
  fVar214 = auVar49._4_4_;
  auVar233._4_4_ = fVar214 * auVar36._4_4_;
  fVar215 = auVar49._8_4_;
  auVar233._8_4_ = fVar215 * auVar36._8_4_;
  fVar216 = auVar49._12_4_;
  auVar233._12_4_ = fVar216 * auVar36._12_4_;
  auVar36 = vfmsub231ps_avx512vl(auVar233,auVar39,auVar47);
  auVar36 = vshufps_avx(auVar36,auVar36,0xc9);
  auVar47 = vshufps_avx512vl(auVar40,auVar40,0xc9);
  auVar241._0_4_ = fVar213 * auVar47._0_4_;
  auVar241._4_4_ = fVar214 * auVar47._4_4_;
  auVar241._8_4_ = fVar215 * auVar47._8_4_;
  auVar241._12_4_ = fVar216 * auVar47._12_4_;
  auVar39 = vfmsub231ps_avx512vl(auVar241,auVar39,auVar40);
  auVar47 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar40 = vshufps_avx512vl(auVar38,auVar38,0xc9);
  auVar39 = vshufps_avx(auVar52,auVar52,0xc9);
  auVar39 = vmulps_avx512vl(auVar38,auVar39);
  auVar39 = vfmsub231ps_fma(auVar39,auVar40,auVar52);
  auVar52 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vshufps_avx(auVar37,auVar37,0xc9);
  auVar39 = vmulps_avx512vl(auVar38,auVar39);
  auVar39 = vfmsub231ps_fma(auVar39,auVar40,auVar37);
  auVar37 = vshufps_avx(auVar39,auVar39,0xc9);
  auVar39 = vdpps_avx(auVar36,auVar36,0x7f);
  auVar60._16_16_ = auVar77._16_16_;
  auVar60._0_16_ = auVar73._0_16_;
  auVar61._4_28_ = auVar60._4_28_;
  auVar61._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar73._0_16_,auVar61._0_16_);
  auVar54 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar55 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar55 = vmulss_avx512f(auVar55,auVar40);
  auVar40 = vmulss_avx512f(auVar40,auVar40);
  auVar40 = vmulss_avx512f(auVar55,auVar40);
  auVar40 = vsubss_avx512f(auVar54,auVar40);
  auVar54 = vbroadcastss_avx512vl(auVar40);
  auVar55 = vmulps_avx512vl(auVar36,auVar54);
  auVar40 = vdpps_avx(auVar36,auVar47,0x7f);
  auVar56 = vbroadcastss_avx512vl(auVar39);
  auVar47 = vmulps_avx512vl(auVar56,auVar47);
  fVar218 = auVar40._0_4_;
  auVar140._0_4_ = auVar36._0_4_ * fVar218;
  auVar140._4_4_ = auVar36._4_4_ * fVar218;
  auVar140._8_4_ = auVar36._8_4_ * fVar218;
  auVar140._12_4_ = auVar36._12_4_ * fVar218;
  auVar40 = vsubps_avx(auVar47,auVar140);
  auVar36 = vrcp14ss_avx512f(auVar73._0_16_,auVar61._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar36,ZEXT416(0x40000000));
  fVar218 = auVar36._0_4_ * auVar39._0_4_;
  auVar39 = vdpps_avx(auVar52,auVar52,0x7f);
  auVar141._0_4_ = fVar218 * auVar40._0_4_;
  auVar141._4_4_ = fVar218 * auVar40._4_4_;
  auVar141._8_4_ = fVar218 * auVar40._8_4_;
  auVar141._12_4_ = fVar218 * auVar40._12_4_;
  auVar36 = vmulps_avx512vl(auVar54,auVar141);
  auVar63._16_16_ = auVar77._16_16_;
  auVar63._0_16_ = auVar73._0_16_;
  auVar62._4_28_ = auVar63._4_28_;
  auVar62._0_4_ = auVar39._0_4_;
  auVar40 = vrsqrt14ss_avx512f(auVar73._0_16_,auVar62._0_16_);
  auVar47 = vmulss_avx512f(auVar40,ZEXT416(0x3fc00000));
  auVar54 = vmulss_avx512f(auVar39,ZEXT416(0x3f000000));
  auVar256 = ZEXT464(0x3f800000);
  auVar54 = vmulss_avx512f(auVar54,auVar40);
  auVar40 = vmulss_avx512f(auVar54,ZEXT416((uint)(auVar40._0_4_ * auVar40._0_4_)));
  fVar201 = auVar47._0_4_ - auVar40._0_4_;
  auVar248._0_4_ = auVar52._0_4_ * fVar201;
  auVar248._4_4_ = auVar52._4_4_ * fVar201;
  auVar248._8_4_ = auVar52._8_4_ * fVar201;
  auVar248._12_4_ = auVar52._12_4_ * fVar201;
  auVar40 = vdpps_avx(auVar52,auVar37,0x7f);
  auVar47 = vbroadcastss_avx512vl(auVar39);
  auVar47 = vmulps_avx512vl(auVar47,auVar37);
  fVar218 = auVar40._0_4_;
  auVar155._0_4_ = auVar52._0_4_ * fVar218;
  auVar155._4_4_ = auVar52._4_4_ * fVar218;
  auVar155._8_4_ = auVar52._8_4_ * fVar218;
  auVar155._12_4_ = auVar52._12_4_ * fVar218;
  auVar40 = vsubps_avx(auVar47,auVar155);
  auVar47 = vrcp14ss_avx512f(auVar73._0_16_,auVar62._0_16_);
  auVar39 = vfnmadd213ss_avx512f(auVar39,auVar47,ZEXT416(0x40000000));
  fVar218 = auVar47._0_4_ * auVar39._0_4_;
  auVar47 = vshufps_avx512vl(auVar48,auVar48,0xff);
  auVar52 = vmulps_avx512vl(auVar47,auVar55);
  auVar37 = vsubps_avx512vl(auVar48,auVar52);
  auVar39 = vshufps_avx(auVar49,auVar49,0xff);
  auVar39 = vmulps_avx512vl(auVar39,auVar55);
  auVar142._0_4_ = auVar39._0_4_ + auVar47._0_4_ * auVar36._0_4_;
  auVar142._4_4_ = auVar39._4_4_ + auVar47._4_4_ * auVar36._4_4_;
  auVar142._8_4_ = auVar39._8_4_ + auVar47._8_4_ * auVar36._8_4_;
  auVar142._12_4_ = auVar39._12_4_ + auVar47._12_4_ * auVar36._12_4_;
  auVar39 = vsubps_avx(auVar49,auVar142);
  auVar36 = vaddps_avx512vl(auVar48,auVar52);
  auVar47 = vshufps_avx512vl(auVar53,auVar53,0xff);
  auVar234._0_4_ = auVar47._0_4_ * auVar248._0_4_;
  auVar234._4_4_ = auVar47._4_4_ * auVar248._4_4_;
  auVar234._8_4_ = auVar47._8_4_ * auVar248._8_4_;
  auVar234._12_4_ = auVar47._12_4_ * auVar248._12_4_;
  auVar52 = vsubps_avx512vl(auVar53,auVar234);
  auVar54 = vshufps_avx512vl(auVar38,auVar38,0xff);
  auVar54 = vmulps_avx512vl(auVar54,auVar248);
  auVar156._0_4_ = auVar54._0_4_ + auVar47._0_4_ * fVar201 * fVar218 * auVar40._0_4_;
  auVar156._4_4_ = auVar54._4_4_ + auVar47._4_4_ * fVar201 * fVar218 * auVar40._4_4_;
  auVar156._8_4_ = auVar54._8_4_ + auVar47._8_4_ * fVar201 * fVar218 * auVar40._8_4_;
  auVar156._12_4_ = auVar54._12_4_ + auVar47._12_4_ * fVar201 * fVar218 * auVar40._12_4_;
  auVar40 = vsubps_avx512vl(auVar38,auVar156);
  auVar47 = vaddps_avx512vl(auVar53,auVar234);
  auVar38 = vaddps_avx512vl(auVar38,auVar156);
  auVar202._0_4_ = auVar37._0_4_ + auVar39._0_4_ * 0.33333334;
  auVar202._4_4_ = auVar37._4_4_ + auVar39._4_4_ * 0.33333334;
  auVar202._8_4_ = auVar37._8_4_ + auVar39._8_4_ * 0.33333334;
  auVar202._12_4_ = auVar37._12_4_ + auVar39._12_4_ * 0.33333334;
  auVar193._0_4_ = auVar40._0_4_ * 0.33333334;
  auVar193._4_4_ = auVar40._4_4_ * 0.33333334;
  auVar193._8_4_ = auVar40._8_4_ * 0.33333334;
  auVar193._12_4_ = auVar40._12_4_ * 0.33333334;
  auVar39 = vsubps_avx(auVar52,auVar193);
  auVar143._0_4_ = auVar36._0_4_ + (fVar213 + auVar142._0_4_) * 0.33333334;
  auVar143._4_4_ = auVar36._4_4_ + (fVar214 + auVar142._4_4_) * 0.33333334;
  auVar143._8_4_ = auVar36._8_4_ + (fVar215 + auVar142._8_4_) * 0.33333334;
  auVar143._12_4_ = auVar36._12_4_ + (fVar216 + auVar142._12_4_) * 0.33333334;
  auVar157._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar157._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar157._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar157._12_4_ = auVar38._12_4_ * 0.33333334;
  auVar40 = vsubps_avx(auVar47,auVar157);
  auVar38 = vbroadcastss_avx512vl(auVar41);
  auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar41);
  auVar94._0_4_ = auVar54._0_4_;
  auVar94._4_4_ = auVar94._0_4_;
  auVar94._8_4_ = auVar94._0_4_;
  auVar94._12_4_ = auVar94._0_4_;
  auVar37 = vmulps_avx512vl(auVar38,auVar37);
  auVar54 = vmulps_avx512vl(auVar38,auVar202);
  auVar39 = vmulps_avx512vl(auVar38,auVar39);
  auVar242._0_4_ = auVar38._0_4_ * auVar52._0_4_;
  auVar242._4_4_ = auVar38._4_4_ * auVar52._4_4_;
  auVar242._8_4_ = auVar38._8_4_ * auVar52._8_4_;
  auVar242._12_4_ = auVar38._12_4_ * auVar52._12_4_;
  local_218 = vfmadd231ps_avx512vl(auVar37,auVar94,auVar44);
  local_228 = vfmadd231ps_avx512vl(auVar54,auVar94,auVar167);
  local_238 = vfmadd231ps_avx512vl(auVar39,auVar94,auVar50);
  local_248 = vfmadd231ps_fma(auVar242,auVar94,auVar42);
  auVar39 = vmulps_avx512vl(auVar38,auVar36);
  auVar36 = vmulps_avx512vl(auVar38,auVar143);
  auVar40 = vmulps_avx512vl(auVar38,auVar40);
  auVar235._0_4_ = auVar38._0_4_ * auVar47._0_4_;
  auVar235._4_4_ = auVar38._4_4_ * auVar47._4_4_;
  auVar235._8_4_ = auVar38._8_4_ * auVar47._8_4_;
  auVar235._12_4_ = auVar38._12_4_ * auVar47._12_4_;
  _local_258 = vfmadd231ps_avx512vl(auVar39,auVar94,auVar43);
  _local_268 = vfmadd231ps_avx512vl(auVar36,auVar94,auVar46);
  _local_278 = vfmadd231ps_avx512vl(auVar40,auVar94,auVar51);
  _local_288 = vfmadd231ps_fma(auVar235,auVar94,auVar45);
  aVar2 = (ray->org).field_0;
  auVar40 = vsubps_avx512vl(local_218,(undefined1  [16])aVar2);
  uVar92 = auVar40._0_4_;
  auVar98._4_4_ = uVar92;
  auVar98._0_4_ = uVar92;
  auVar98._8_4_ = uVar92;
  auVar98._12_4_ = uVar92;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  aVar3 = (pre->ray_space).vx.field_0;
  aVar4 = (pre->ray_space).vy.field_0;
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  fVar218 = (pre->ray_space).vz.field_0.m128[0];
  fVar201 = (pre->ray_space).vz.field_0.m128[1];
  fVar213 = (pre->ray_space).vz.field_0.m128[2];
  fVar214 = (pre->ray_space).vz.field_0.m128[3];
  auVar95._0_4_ = fVar218 * auVar40._0_4_;
  auVar95._4_4_ = fVar201 * auVar40._4_4_;
  auVar95._8_4_ = fVar213 * auVar40._8_4_;
  auVar95._12_4_ = fVar214 * auVar40._12_4_;
  auVar39 = vfmadd231ps_fma(auVar95,(undefined1  [16])aVar4,auVar39);
  auVar37 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar98);
  auVar40 = vsubps_avx512vl(local_228,(undefined1  [16])aVar2);
  uVar92 = auVar40._0_4_;
  auVar109._4_4_ = uVar92;
  auVar109._0_4_ = uVar92;
  auVar109._8_4_ = uVar92;
  auVar109._12_4_ = uVar92;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar99._0_4_ = fVar218 * auVar40._0_4_;
  auVar99._4_4_ = fVar201 * auVar40._4_4_;
  auVar99._8_4_ = fVar213 * auVar40._8_4_;
  auVar99._12_4_ = fVar214 * auVar40._12_4_;
  auVar39 = vfmadd231ps_fma(auVar99,(undefined1  [16])aVar4,auVar39);
  auVar50 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar109);
  auVar40 = vsubps_avx512vl(local_238,(undefined1  [16])aVar2);
  uVar92 = auVar40._0_4_;
  auVar158._4_4_ = uVar92;
  auVar158._0_4_ = uVar92;
  auVar158._8_4_ = uVar92;
  auVar158._12_4_ = uVar92;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar110._0_4_ = fVar218 * auVar40._0_4_;
  auVar110._4_4_ = fVar201 * auVar40._4_4_;
  auVar110._8_4_ = fVar213 * auVar40._8_4_;
  auVar110._12_4_ = fVar214 * auVar40._12_4_;
  auVar39 = vfmadd231ps_fma(auVar110,(undefined1  [16])aVar4,auVar39);
  auVar51 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar158);
  auVar40 = vsubps_avx(local_248,(undefined1  [16])aVar2);
  uVar92 = auVar40._0_4_;
  auVar184._4_4_ = uVar92;
  auVar184._0_4_ = uVar92;
  auVar184._8_4_ = uVar92;
  auVar184._12_4_ = uVar92;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar159._0_4_ = fVar218 * auVar40._0_4_;
  auVar159._4_4_ = fVar201 * auVar40._4_4_;
  auVar159._8_4_ = fVar213 * auVar40._8_4_;
  auVar159._12_4_ = fVar214 * auVar40._12_4_;
  auVar39 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar4,auVar39);
  auVar38 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar184);
  auVar40 = vsubps_avx512vl(_local_258,(undefined1  [16])aVar2);
  uVar92 = auVar40._0_4_;
  auVar194._4_4_ = uVar92;
  auVar194._0_4_ = uVar92;
  auVar194._8_4_ = uVar92;
  auVar194._12_4_ = uVar92;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar185._0_4_ = auVar40._0_4_ * fVar218;
  auVar185._4_4_ = auVar40._4_4_ * fVar201;
  auVar185._8_4_ = auVar40._8_4_ * fVar213;
  auVar185._12_4_ = auVar40._12_4_ * fVar214;
  auVar39 = vfmadd231ps_fma(auVar185,(undefined1  [16])aVar4,auVar39);
  auVar54 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar194);
  auVar40 = vsubps_avx512vl(_local_268,(undefined1  [16])aVar2);
  uVar92 = auVar40._0_4_;
  auVar203._4_4_ = uVar92;
  auVar203._0_4_ = uVar92;
  auVar203._8_4_ = uVar92;
  auVar203._12_4_ = uVar92;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar195._0_4_ = auVar40._0_4_ * fVar218;
  auVar195._4_4_ = auVar40._4_4_ * fVar201;
  auVar195._8_4_ = auVar40._8_4_ * fVar213;
  auVar195._12_4_ = auVar40._12_4_ * fVar214;
  auVar39 = vfmadd231ps_fma(auVar195,(undefined1  [16])aVar4,auVar39);
  auVar55 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar203);
  auVar40 = vsubps_avx512vl(_local_278,(undefined1  [16])aVar2);
  uVar92 = auVar40._0_4_;
  auVar219._4_4_ = uVar92;
  auVar219._0_4_ = uVar92;
  auVar219._8_4_ = uVar92;
  auVar219._12_4_ = uVar92;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar204._0_4_ = auVar40._0_4_ * fVar218;
  auVar204._4_4_ = auVar40._4_4_ * fVar201;
  auVar204._8_4_ = auVar40._8_4_ * fVar213;
  auVar204._12_4_ = auVar40._12_4_ * fVar214;
  auVar39 = vfmadd231ps_fma(auVar204,(undefined1  [16])aVar4,auVar39);
  auVar56 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar219);
  auVar40 = vsubps_avx(_local_288,(undefined1  [16])aVar2);
  uVar92 = auVar40._0_4_;
  auVar220._4_4_ = uVar92;
  auVar220._0_4_ = uVar92;
  auVar220._8_4_ = uVar92;
  auVar220._12_4_ = uVar92;
  auVar39 = vshufps_avx(auVar40,auVar40,0x55);
  auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
  auVar129._0_4_ = fVar218 * auVar40._0_4_;
  auVar129._4_4_ = fVar201 * auVar40._4_4_;
  auVar129._8_4_ = fVar213 * auVar40._8_4_;
  auVar129._12_4_ = fVar214 * auVar40._12_4_;
  auVar39 = vfmadd231ps_fma(auVar129,(undefined1  [16])aVar4,auVar39);
  auVar58 = vfmadd231ps_fma(auVar39,(undefined1  [16])aVar3,auVar220);
  auVar36 = vmovlhps_avx(auVar37,auVar54);
  local_328 = vmovlhps_avx(auVar50,auVar55);
  local_2e8 = vmovlhps_avx512f(auVar51,auVar56);
  _local_1f8 = vmovlhps_avx512f(auVar38,auVar58);
  auVar40 = vminps_avx(auVar36,local_328);
  auVar39 = vmaxps_avx(auVar36,local_328);
  auVar47 = vminps_avx512vl(local_2e8,_local_1f8);
  auVar40 = vminps_avx(auVar40,auVar47);
  auVar47 = vmaxps_avx512vl(local_2e8,_local_1f8);
  auVar39 = vmaxps_avx(auVar39,auVar47);
  auVar47 = vshufpd_avx(auVar40,auVar40,3);
  auVar52 = vshufpd_avx(auVar39,auVar39,3);
  auVar40 = vminps_avx(auVar40,auVar47);
  auVar39 = vmaxps_avx(auVar39,auVar52);
  auVar40 = vandps_avx512vl(auVar40,auVar254._0_16_);
  auVar39 = vandps_avx512vl(auVar39,auVar254._0_16_);
  auVar39 = vmaxps_avx(auVar40,auVar39);
  auVar40 = vmovshdup_avx(auVar39);
  auVar39 = vmaxss_avx(auVar40,auVar39);
  lVar31 = uVar34 + 0xf;
  local_178._8_8_ = auVar37._0_8_;
  local_178._0_8_ = auVar37._0_8_;
  local_188._8_8_ = auVar50._0_8_;
  local_188._0_8_ = auVar50._0_8_;
  local_198 = vmovddup_avx512vl(auVar51);
  local_1a8._0_8_ = auVar38._0_8_;
  local_1a8._8_8_ = local_1a8._0_8_;
  register0x00001348 = auVar54._0_8_;
  local_1b8 = auVar54._0_8_;
  register0x00001408 = auVar55._0_8_;
  local_1c8 = auVar55._0_8_;
  register0x00001448 = auVar56._0_8_;
  local_1d8 = auVar56._0_8_;
  register0x00001488 = auVar58._0_8_;
  local_1e8 = auVar58._0_8_;
  local_208 = ZEXT416((uint)(auVar39._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_208);
  auVar17._8_4_ = 0x80000000;
  auVar17._0_8_ = 0x8000000080000000;
  auVar17._12_4_ = 0x80000000;
  auVar39 = vxorps_avx512vl(local_78._0_16_,auVar17);
  local_98 = vbroadcastss_avx512vl(auVar39);
  local_308 = vsubps_avx(local_328,auVar36);
  local_c8 = vsubps_avx512vl(local_2e8,local_328);
  local_d8 = vsubps_avx512vl(_local_1f8,local_2e8);
  local_f8 = vsubps_avx512vl(_local_258,local_218);
  local_108 = vsubps_avx512vl(_local_268,local_228);
  local_118 = vsubps_avx512vl(_local_278,local_238);
  _local_128 = vsubps_avx(_local_288,local_248);
  bVar33 = false;
  auVar39 = ZEXT816(0x3f80000000000000);
  auVar250 = ZEXT1664(auVar39);
  uVar24 = 0;
  do {
    in_ZMM31 = ZEXT3264(local_78);
    auVar54 = auVar250._0_16_;
    auVar40 = vshufps_avx(auVar54,auVar54,0x50);
    auVar236._8_4_ = 0x3f800000;
    auVar236._0_8_ = &DAT_3f8000003f800000;
    auVar236._12_4_ = 0x3f800000;
    auVar239._16_4_ = 0x3f800000;
    auVar239._0_16_ = auVar236;
    auVar239._20_4_ = 0x3f800000;
    auVar239._24_4_ = 0x3f800000;
    auVar239._28_4_ = 0x3f800000;
    auVar47 = vsubps_avx(auVar236,auVar40);
    fVar218 = auVar40._0_4_;
    auVar117._0_4_ = local_1b8._0_4_ * fVar218;
    fVar201 = auVar40._4_4_;
    auVar117._4_4_ = local_1b8._4_4_ * fVar201;
    fVar213 = auVar40._8_4_;
    auVar117._8_4_ = local_1b8._8_4_ * fVar213;
    fVar214 = auVar40._12_4_;
    auVar117._12_4_ = local_1b8._12_4_ * fVar214;
    auVar130._0_4_ = local_1c8._0_4_ * fVar218;
    auVar130._4_4_ = local_1c8._4_4_ * fVar201;
    auVar130._8_4_ = local_1c8._8_4_ * fVar213;
    auVar130._12_4_ = local_1c8._12_4_ * fVar214;
    auVar144._0_4_ = local_1d8._0_4_ * fVar218;
    auVar144._4_4_ = local_1d8._4_4_ * fVar201;
    auVar144._8_4_ = local_1d8._8_4_ * fVar213;
    auVar144._12_4_ = local_1d8._12_4_ * fVar214;
    auVar100._0_4_ = local_1e8._0_4_ * fVar218;
    auVar100._4_4_ = local_1e8._4_4_ * fVar201;
    auVar100._8_4_ = local_1e8._8_4_ * fVar213;
    auVar100._12_4_ = local_1e8._12_4_ * fVar214;
    auVar52 = vfmadd231ps_fma(auVar117,auVar47,local_178);
    auVar37 = vfmadd231ps_fma(auVar130,auVar47,local_188);
    auVar50 = vfmadd231ps_avx512vl(auVar144,auVar47,local_198);
    auVar47 = vfmadd231ps_fma(auVar100,local_1a8,auVar47);
    auVar40 = vmovshdup_avx(auVar39);
    fVar201 = auVar39._0_4_;
    fVar218 = (auVar40._0_4_ - fVar201) * 0.04761905;
    auVar123._4_4_ = fVar201;
    auVar123._0_4_ = fVar201;
    auVar123._8_4_ = fVar201;
    auVar123._12_4_ = fVar201;
    auVar123._16_4_ = fVar201;
    auVar123._20_4_ = fVar201;
    auVar123._24_4_ = fVar201;
    auVar123._28_4_ = fVar201;
    auVar69._0_8_ = auVar40._0_8_;
    auVar69._8_8_ = auVar69._0_8_;
    auVar69._16_8_ = auVar69._0_8_;
    auVar69._24_8_ = auVar69._0_8_;
    auVar77 = vsubps_avx(auVar69,auVar123);
    uVar92 = auVar52._0_4_;
    auVar79._4_4_ = uVar92;
    auVar79._0_4_ = uVar92;
    auVar79._8_4_ = uVar92;
    auVar79._12_4_ = uVar92;
    auVar79._16_4_ = uVar92;
    auVar79._20_4_ = uVar92;
    auVar79._24_4_ = uVar92;
    auVar79._28_4_ = uVar92;
    auVar71._8_4_ = 1;
    auVar71._0_8_ = 0x100000001;
    auVar71._12_4_ = 1;
    auVar71._16_4_ = 1;
    auVar71._20_4_ = 1;
    auVar71._24_4_ = 1;
    auVar71._28_4_ = 1;
    auVar75 = ZEXT1632(auVar52);
    auVar73 = vpermps_avx2(auVar71,auVar75);
    auVar59 = vbroadcastss_avx512vl(auVar37);
    auVar76 = ZEXT1632(auVar37);
    auVar60 = vpermps_avx512vl(auVar71,auVar76);
    auVar61 = vbroadcastss_avx512vl(auVar50);
    auVar74 = ZEXT1632(auVar50);
    auVar62 = vpermps_avx512vl(auVar71,auVar74);
    auVar63 = vbroadcastss_avx512vl(auVar47);
    auVar72 = ZEXT1632(auVar47);
    auVar64 = vpermps_avx512vl(auVar71,auVar72);
    auVar199._4_4_ = fVar218;
    auVar199._0_4_ = fVar218;
    auVar199._8_4_ = fVar218;
    auVar199._12_4_ = fVar218;
    auVar199._16_4_ = fVar218;
    auVar199._20_4_ = fVar218;
    auVar199._24_4_ = fVar218;
    auVar199._28_4_ = fVar218;
    auVar70._8_4_ = 2;
    auVar70._0_8_ = 0x200000002;
    auVar70._12_4_ = 2;
    auVar70._16_4_ = 2;
    auVar70._20_4_ = 2;
    auVar70._24_4_ = 2;
    auVar70._28_4_ = 2;
    auVar65 = vpermps_avx512vl(auVar70,auVar75);
    auVar66 = vbroadcastss_avx512vl(ZEXT416(3));
    auVar67 = vpermps_avx512vl(auVar66,auVar75);
    auVar75 = vpermps_avx2(auVar70,auVar76);
    auVar68 = vpermps_avx512vl(auVar66,auVar76);
    auVar76 = vpermps_avx2(auVar70,auVar74);
    auVar69 = vpermps_avx512vl(auVar66,auVar74);
    auVar70 = vpermps_avx512vl(auVar70,auVar72);
    auVar71 = vpermps_avx512vl(auVar66,auVar72);
    auVar40 = vfmadd132ps_fma(auVar77,auVar123,_DAT_02020f20);
    auVar77 = vsubps_avx(auVar239,ZEXT1632(auVar40));
    auVar66 = vmulps_avx512vl(auVar59,ZEXT1632(auVar40));
    auVar74 = ZEXT1632(auVar40);
    auVar72 = vmulps_avx512vl(auVar60,auVar74);
    auVar47 = vfmadd231ps_fma(auVar66,auVar77,auVar79);
    auVar52 = vfmadd231ps_fma(auVar72,auVar77,auVar73);
    auVar66 = vmulps_avx512vl(auVar61,auVar74);
    auVar72 = vmulps_avx512vl(auVar62,auVar74);
    auVar59 = vfmadd231ps_avx512vl(auVar66,auVar77,auVar59);
    auVar60 = vfmadd231ps_avx512vl(auVar72,auVar77,auVar60);
    auVar66 = vmulps_avx512vl(auVar63,auVar74);
    auVar79 = ZEXT1632(auVar40);
    auVar64 = vmulps_avx512vl(auVar64,auVar79);
    auVar61 = vfmadd231ps_avx512vl(auVar66,auVar77,auVar61);
    auVar62 = vfmadd231ps_avx512vl(auVar64,auVar77,auVar62);
    fVar213 = auVar40._0_4_;
    fVar214 = auVar40._4_4_;
    auVar64._4_4_ = fVar214 * auVar59._4_4_;
    auVar64._0_4_ = fVar213 * auVar59._0_4_;
    fVar215 = auVar40._8_4_;
    auVar64._8_4_ = fVar215 * auVar59._8_4_;
    fVar216 = auVar40._12_4_;
    auVar64._12_4_ = fVar216 * auVar59._12_4_;
    auVar64._16_4_ = auVar59._16_4_ * 0.0;
    auVar64._20_4_ = auVar59._20_4_ * 0.0;
    auVar64._24_4_ = auVar59._24_4_ * 0.0;
    auVar64._28_4_ = fVar201;
    auVar66._4_4_ = fVar214 * auVar60._4_4_;
    auVar66._0_4_ = fVar213 * auVar60._0_4_;
    auVar66._8_4_ = fVar215 * auVar60._8_4_;
    auVar66._12_4_ = fVar216 * auVar60._12_4_;
    auVar66._16_4_ = auVar60._16_4_ * 0.0;
    auVar66._20_4_ = auVar60._20_4_ * 0.0;
    auVar66._24_4_ = auVar60._24_4_ * 0.0;
    auVar66._28_4_ = auVar73._28_4_;
    auVar47 = vfmadd231ps_fma(auVar64,auVar77,ZEXT1632(auVar47));
    auVar52 = vfmadd231ps_fma(auVar66,auVar77,ZEXT1632(auVar52));
    auVar78._0_4_ = fVar213 * auVar61._0_4_;
    auVar78._4_4_ = fVar214 * auVar61._4_4_;
    auVar78._8_4_ = fVar215 * auVar61._8_4_;
    auVar78._12_4_ = fVar216 * auVar61._12_4_;
    auVar78._16_4_ = auVar61._16_4_ * 0.0;
    auVar78._20_4_ = auVar61._20_4_ * 0.0;
    auVar78._24_4_ = auVar61._24_4_ * 0.0;
    auVar78._28_4_ = 0;
    auVar72._4_4_ = fVar214 * auVar62._4_4_;
    auVar72._0_4_ = fVar213 * auVar62._0_4_;
    auVar72._8_4_ = fVar215 * auVar62._8_4_;
    auVar72._12_4_ = fVar216 * auVar62._12_4_;
    auVar72._16_4_ = auVar62._16_4_ * 0.0;
    auVar72._20_4_ = auVar62._20_4_ * 0.0;
    auVar72._24_4_ = auVar62._24_4_ * 0.0;
    auVar72._28_4_ = auVar61._28_4_;
    auVar37 = vfmadd231ps_fma(auVar78,auVar77,auVar59);
    auVar50 = vfmadd231ps_fma(auVar72,auVar77,auVar60);
    auVar74._28_4_ = auVar60._28_4_;
    auVar74._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * auVar50._12_4_,
                            CONCAT48(fVar215 * auVar50._8_4_,
                                     CONCAT44(fVar214 * auVar50._4_4_,fVar213 * auVar50._0_4_))));
    auVar51 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar216 * auVar37._12_4_,
                                                 CONCAT48(fVar215 * auVar37._8_4_,
                                                          CONCAT44(fVar214 * auVar37._4_4_,
                                                                   fVar213 * auVar37._0_4_)))),
                              auVar77,ZEXT1632(auVar47));
    auVar38 = vfmadd231ps_fma(auVar74,auVar77,ZEXT1632(auVar52));
    auVar73 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar47));
    auVar59 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar52));
    auVar60 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar73 = vmulps_avx512vl(auVar73,auVar60);
    auVar59 = vmulps_avx512vl(auVar59,auVar60);
    auVar134._0_4_ = fVar218 * auVar73._0_4_;
    auVar134._4_4_ = fVar218 * auVar73._4_4_;
    auVar134._8_4_ = fVar218 * auVar73._8_4_;
    auVar134._12_4_ = fVar218 * auVar73._12_4_;
    auVar134._16_4_ = fVar218 * auVar73._16_4_;
    auVar134._20_4_ = fVar218 * auVar73._20_4_;
    auVar134._24_4_ = fVar218 * auVar73._24_4_;
    auVar134._28_4_ = 0;
    auVar73 = vmulps_avx512vl(auVar199,auVar59);
    auVar37 = vxorps_avx512vl(auVar63._0_16_,auVar63._0_16_);
    auVar59 = vpermt2ps_avx512vl(ZEXT1632(auVar51),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar61 = vpermt2ps_avx512vl(ZEXT1632(auVar38),_DAT_0205fd20,ZEXT1632(auVar37));
    auVar106._0_4_ = auVar134._0_4_ + auVar51._0_4_;
    auVar106._4_4_ = auVar134._4_4_ + auVar51._4_4_;
    auVar106._8_4_ = auVar134._8_4_ + auVar51._8_4_;
    auVar106._12_4_ = auVar134._12_4_ + auVar51._12_4_;
    auVar106._16_4_ = auVar134._16_4_ + 0.0;
    auVar106._20_4_ = auVar134._20_4_ + 0.0;
    auVar106._24_4_ = auVar134._24_4_ + 0.0;
    auVar106._28_4_ = 0;
    auVar78 = ZEXT1632(auVar37);
    auVar62 = vpermt2ps_avx512vl(auVar134,_DAT_0205fd20,auVar78);
    auVar63 = vaddps_avx512vl(ZEXT1632(auVar38),auVar73);
    auVar64 = vpermt2ps_avx512vl(auVar73,_DAT_0205fd20,auVar78);
    auVar73 = vsubps_avx(auVar59,auVar62);
    auVar62 = vsubps_avx512vl(auVar61,auVar64);
    auVar64 = vmulps_avx512vl(auVar75,auVar79);
    auVar66 = vmulps_avx512vl(auVar68,auVar79);
    auVar64 = vfmadd231ps_avx512vl(auVar64,auVar77,auVar65);
    auVar66 = vfmadd231ps_avx512vl(auVar66,auVar77,auVar67);
    auVar72 = vmulps_avx512vl(auVar76,auVar79);
    auVar74 = vmulps_avx512vl(auVar69,auVar79);
    auVar75 = vfmadd231ps_avx512vl(auVar72,auVar77,auVar75);
    auVar72 = vfmadd231ps_avx512vl(auVar74,auVar77,auVar68);
    auVar74 = vmulps_avx512vl(auVar70,auVar79);
    auVar65 = vmulps_avx512vl(auVar71,auVar79);
    auVar47 = vfmadd231ps_fma(auVar74,auVar77,auVar76);
    auVar52 = vfmadd231ps_fma(auVar65,auVar77,auVar69);
    auVar74 = vmulps_avx512vl(auVar79,auVar75);
    auVar65 = vmulps_avx512vl(ZEXT1632(auVar40),auVar72);
    auVar64 = vfmadd231ps_avx512vl(auVar74,auVar77,auVar64);
    auVar66 = vfmadd231ps_avx512vl(auVar65,auVar77,auVar66);
    auVar75 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar216 * auVar47._12_4_,
                                            CONCAT48(fVar215 * auVar47._8_4_,
                                                     CONCAT44(fVar214 * auVar47._4_4_,
                                                              fVar213 * auVar47._0_4_)))),auVar77,
                         auVar75);
    auVar72 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar216 * auVar52._12_4_,
                                            CONCAT48(fVar215 * auVar52._8_4_,
                                                     CONCAT44(fVar214 * auVar52._4_4_,
                                                              fVar213 * auVar52._0_4_)))),auVar77,
                         auVar72);
    auVar65._4_4_ = fVar214 * auVar75._4_4_;
    auVar65._0_4_ = fVar213 * auVar75._0_4_;
    auVar65._8_4_ = fVar215 * auVar75._8_4_;
    auVar65._12_4_ = fVar216 * auVar75._12_4_;
    auVar65._16_4_ = auVar75._16_4_ * 0.0;
    auVar65._20_4_ = auVar75._20_4_ * 0.0;
    auVar65._24_4_ = auVar75._24_4_ * 0.0;
    auVar65._28_4_ = auVar69._28_4_;
    auVar67._4_4_ = fVar214 * auVar72._4_4_;
    auVar67._0_4_ = fVar213 * auVar72._0_4_;
    auVar67._8_4_ = fVar215 * auVar72._8_4_;
    auVar67._12_4_ = fVar216 * auVar72._12_4_;
    auVar67._16_4_ = auVar72._16_4_ * 0.0;
    auVar67._20_4_ = auVar72._20_4_ * 0.0;
    auVar67._24_4_ = auVar72._24_4_ * 0.0;
    auVar67._28_4_ = auVar76._28_4_;
    auVar76 = vfmadd231ps_avx512vl(auVar65,auVar77,auVar64);
    auVar74 = vfmadd231ps_avx512vl(auVar67,auVar66,auVar77);
    auVar77 = vsubps_avx512vl(auVar75,auVar64);
    auVar75 = vsubps_avx512vl(auVar72,auVar66);
    auVar77 = vmulps_avx512vl(auVar77,auVar60);
    auVar75 = vmulps_avx512vl(auVar75,auVar60);
    fVar201 = fVar218 * auVar77._0_4_;
    fVar213 = fVar218 * auVar77._4_4_;
    auVar68._4_4_ = fVar213;
    auVar68._0_4_ = fVar201;
    fVar214 = fVar218 * auVar77._8_4_;
    auVar68._8_4_ = fVar214;
    fVar215 = fVar218 * auVar77._12_4_;
    auVar68._12_4_ = fVar215;
    fVar216 = fVar218 * auVar77._16_4_;
    auVar68._16_4_ = fVar216;
    fVar217 = fVar218 * auVar77._20_4_;
    auVar68._20_4_ = fVar217;
    fVar218 = fVar218 * auVar77._24_4_;
    auVar68._24_4_ = fVar218;
    auVar68._28_4_ = auVar77._28_4_;
    auVar75 = vmulps_avx512vl(auVar199,auVar75);
    auVar60 = vpermt2ps_avx512vl(auVar76,_DAT_0205fd20,auVar78);
    auVar64 = vpermt2ps_avx512vl(auVar74,_DAT_0205fd20,auVar78);
    auVar200._0_4_ = auVar76._0_4_ + fVar201;
    auVar200._4_4_ = auVar76._4_4_ + fVar213;
    auVar200._8_4_ = auVar76._8_4_ + fVar214;
    auVar200._12_4_ = auVar76._12_4_ + fVar215;
    auVar200._16_4_ = auVar76._16_4_ + fVar216;
    auVar200._20_4_ = auVar76._20_4_ + fVar217;
    auVar200._24_4_ = auVar76._24_4_ + fVar218;
    auVar200._28_4_ = auVar76._28_4_ + auVar77._28_4_;
    auVar77 = vpermt2ps_avx512vl(auVar68,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar66 = vaddps_avx512vl(auVar74,auVar75);
    auVar75 = vpermt2ps_avx512vl(auVar75,_DAT_0205fd20,ZEXT1632(auVar37));
    auVar77 = vsubps_avx(auVar60,auVar77);
    auVar75 = vsubps_avx512vl(auVar64,auVar75);
    auVar123 = ZEXT1632(auVar51);
    auVar72 = vsubps_avx512vl(auVar76,auVar123);
    auVar134 = ZEXT1632(auVar38);
    auVar65 = vsubps_avx512vl(auVar74,auVar134);
    auVar67 = vsubps_avx512vl(auVar60,auVar59);
    auVar72 = vaddps_avx512vl(auVar72,auVar67);
    auVar67 = vsubps_avx512vl(auVar64,auVar61);
    auVar65 = vaddps_avx512vl(auVar65,auVar67);
    auVar67 = vmulps_avx512vl(auVar134,auVar72);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar123,auVar65);
    auVar68 = vmulps_avx512vl(auVar63,auVar72);
    auVar68 = vfnmadd231ps_avx512vl(auVar68,auVar106,auVar65);
    auVar69 = vmulps_avx512vl(auVar62,auVar72);
    auVar69 = vfnmadd231ps_avx512vl(auVar69,auVar73,auVar65);
    auVar70 = vmulps_avx512vl(auVar61,auVar72);
    auVar70 = vfnmadd231ps_avx512vl(auVar70,auVar59,auVar65);
    auVar71 = vmulps_avx512vl(auVar74,auVar72);
    auVar71 = vfnmadd231ps_avx512vl(auVar71,auVar76,auVar65);
    auVar78 = vmulps_avx512vl(auVar66,auVar72);
    auVar78 = vfnmadd231ps_avx512vl(auVar78,auVar200,auVar65);
    auVar79 = vmulps_avx512vl(auVar75,auVar72);
    auVar79 = vfnmadd231ps_avx512vl(auVar79,auVar77,auVar65);
    auVar72 = vmulps_avx512vl(auVar64,auVar72);
    auVar72 = vfnmadd231ps_avx512vl(auVar72,auVar60,auVar65);
    auVar65 = vminps_avx512vl(auVar67,auVar68);
    auVar67 = vmaxps_avx512vl(auVar67,auVar68);
    auVar68 = vminps_avx512vl(auVar69,auVar70);
    auVar65 = vminps_avx512vl(auVar65,auVar68);
    auVar68 = vmaxps_avx512vl(auVar69,auVar70);
    auVar67 = vmaxps_avx512vl(auVar67,auVar68);
    auVar68 = vminps_avx512vl(auVar71,auVar78);
    auVar69 = vmaxps_avx512vl(auVar71,auVar78);
    auVar70 = vminps_avx512vl(auVar79,auVar72);
    auVar68 = vminps_avx512vl(auVar68,auVar70);
    auVar65 = vminps_avx512vl(auVar65,auVar68);
    auVar72 = vmaxps_avx512vl(auVar79,auVar72);
    auVar72 = vmaxps_avx512vl(auVar69,auVar72);
    auVar72 = vmaxps_avx512vl(auVar67,auVar72);
    uVar14 = vcmpps_avx512vl(auVar65,local_78,2);
    uVar15 = vcmpps_avx512vl(auVar72,local_98,5);
    uVar30 = 0;
    bVar22 = (byte)uVar14 & (byte)uVar15 & 0x7f;
    if (bVar22 != 0) {
      auVar72 = vsubps_avx512vl(auVar59,auVar123);
      auVar65 = vsubps_avx512vl(auVar61,auVar134);
      auVar67 = vsubps_avx512vl(auVar60,auVar76);
      auVar72 = vaddps_avx512vl(auVar72,auVar67);
      auVar67 = vsubps_avx512vl(auVar64,auVar74);
      auVar65 = vaddps_avx512vl(auVar65,auVar67);
      auVar67 = vmulps_avx512vl(auVar134,auVar72);
      auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar65,auVar123);
      auVar63 = vmulps_avx512vl(auVar63,auVar72);
      auVar63 = vfnmadd213ps_avx512vl(auVar106,auVar65,auVar63);
      auVar62 = vmulps_avx512vl(auVar62,auVar72);
      auVar62 = vfnmadd213ps_avx512vl(auVar73,auVar65,auVar62);
      auVar73 = vmulps_avx512vl(auVar61,auVar72);
      auVar61 = vfnmadd231ps_avx512vl(auVar73,auVar65,auVar59);
      auVar73 = vmulps_avx512vl(auVar74,auVar72);
      auVar76 = vfnmadd231ps_avx512vl(auVar73,auVar65,auVar76);
      auVar73 = vmulps_avx512vl(auVar66,auVar72);
      auVar66 = vfnmadd213ps_avx512vl(auVar200,auVar65,auVar73);
      auVar73 = vmulps_avx512vl(auVar75,auVar72);
      auVar74 = vfnmadd213ps_avx512vl(auVar77,auVar65,auVar73);
      auVar77 = vmulps_avx512vl(auVar64,auVar72);
      auVar60 = vfnmadd231ps_avx512vl(auVar77,auVar60,auVar65);
      auVar73 = vminps_avx(auVar67,auVar63);
      auVar77 = vmaxps_avx(auVar67,auVar63);
      auVar59 = vminps_avx(auVar62,auVar61);
      auVar59 = vminps_avx(auVar73,auVar59);
      auVar73 = vmaxps_avx(auVar62,auVar61);
      auVar77 = vmaxps_avx(auVar77,auVar73);
      auVar75 = vminps_avx(auVar76,auVar66);
      auVar73 = vmaxps_avx(auVar76,auVar66);
      auVar76 = vminps_avx(auVar74,auVar60);
      auVar75 = vminps_avx(auVar75,auVar76);
      auVar75 = vminps_avx(auVar59,auVar75);
      auVar59 = vmaxps_avx(auVar74,auVar60);
      auVar73 = vmaxps_avx(auVar73,auVar59);
      auVar77 = vmaxps_avx(auVar77,auVar73);
      uVar14 = vcmpps_avx512vl(auVar77,local_98,5);
      uVar15 = vcmpps_avx512vl(auVar75,local_78,2);
      uVar30 = (uint)(bVar22 & (byte)uVar14 & (byte)uVar15);
    }
    if (uVar30 != 0) {
      auStack_168[uVar24] = uVar30;
      uVar14 = vmovlps_avx(auVar39);
      *(undefined8 *)(&uStack_b8 + uVar24 * 2) = uVar14;
      uVar27 = vmovlps_avx(auVar54);
      auStack_58[uVar24] = uVar27;
      uVar24 = (ulong)((int)uVar24 + 1);
    }
    auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar253 = ZEXT1664(auVar39);
    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar252 = ZEXT3264(auVar77);
    auVar255 = ZEXT1664(local_308);
    auVar251 = ZEXT1664(local_328);
    do {
      in_ZMM19 = ZEXT464(0x3e124925);
      auVar47 = auVar258._0_16_;
      auVar39 = auVar253._0_16_;
      auVar40 = SUB6416(ZEXT464(0xb8d1b717),0);
      if ((int)uVar24 == 0) {
        if (bVar33) {
          return local_379;
        }
        fVar218 = ray->tfar;
        auVar21._4_4_ = fVar218;
        auVar21._0_4_ = fVar218;
        auVar21._8_4_ = fVar218;
        auVar21._12_4_ = fVar218;
        uVar14 = vcmpps_avx512vl(local_e8,auVar21,2);
        uVar32 = (uint)uVar34 & (uint)lVar31 & (uint)uVar14;
        uVar34 = (ulong)uVar32;
        local_379 = uVar32 != 0;
        if (!local_379) {
          return local_379;
        }
        goto LAB_01c1d999;
      }
      uVar23 = (int)uVar24 - 1;
      uVar25 = (ulong)uVar23;
      uVar30 = (&uStack_b8)[uVar25 * 2];
      fVar218 = afStack_b4[uVar25 * 2];
      uVar6 = auStack_168[uVar25];
      auVar249._8_8_ = 0;
      auVar249._0_8_ = auStack_58[uVar25];
      auVar250 = ZEXT1664(auVar249);
      lVar29 = 0;
      for (uVar27 = (ulong)uVar6; (uVar27 & 1) == 0; uVar27 = uVar27 >> 1 | 0x8000000000000000) {
        lVar29 = lVar29 + 1;
      }
      uVar26 = uVar6 - 1 & uVar6;
      auStack_168[uVar25] = uVar26;
      if (uVar26 == 0) {
        uVar24 = (ulong)uVar23;
      }
      auVar37 = vpxord_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
      auVar52 = vcvtsi2ss_avx512f(auVar37,lVar29);
      auVar50 = vmulss_avx512f(auVar52,in_ZMM19._0_16_);
      lVar29 = lVar29 + 1;
      auVar52 = vpxord_avx512vl(auVar37,auVar37);
      auVar52 = vcvtsi2ss_avx512f(auVar52,lVar29);
      auVar52 = vmulss_avx512f(auVar52,in_ZMM19._0_16_);
      auVar51 = auVar256._0_16_;
      auVar37 = vsubss_avx512f(auVar51,auVar50);
      local_318 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * auVar50._0_4_)),ZEXT416(uVar30),auVar37);
      auVar37 = vsubss_avx512f(auVar51,auVar52);
      auVar52 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * auVar52._0_4_)),ZEXT416(uVar30),auVar37);
      fVar201 = auVar52._0_4_;
      fVar213 = local_318._0_4_;
      fVar218 = fVar201 - fVar213;
      vucomiss_avx512f(ZEXT416((uint)fVar218));
      if (uVar6 == 0 || lVar29 == 0) break;
      in_ZMM31 = ZEXT1664(auVar249);
      auVar37 = vshufps_avx(auVar249,auVar249,0x50);
      vucomiss_avx512f(ZEXT416((uint)fVar218));
      uVar30 = (uint)uVar24;
      auVar111._8_4_ = 0x3f800000;
      auVar111._0_8_ = &DAT_3f8000003f800000;
      auVar111._12_4_ = 0x3f800000;
      auVar50 = vsubps_avx(auVar111,auVar37);
      fVar214 = auVar37._0_4_;
      auVar118._0_4_ = fVar214 * (float)local_1b8._0_4_;
      fVar215 = auVar37._4_4_;
      auVar118._4_4_ = fVar215 * (float)local_1b8._4_4_;
      fVar216 = auVar37._8_4_;
      auVar118._8_4_ = fVar216 * fStack_1b0;
      fVar217 = auVar37._12_4_;
      auVar118._12_4_ = fVar217 * fStack_1ac;
      auVar131._0_4_ = fVar214 * (float)local_1c8._0_4_;
      auVar131._4_4_ = fVar215 * (float)local_1c8._4_4_;
      auVar131._8_4_ = fVar216 * fStack_1c0;
      auVar131._12_4_ = fVar217 * fStack_1bc;
      auVar145._0_4_ = fVar214 * (float)local_1d8._0_4_;
      auVar145._4_4_ = fVar215 * (float)local_1d8._4_4_;
      auVar145._8_4_ = fVar216 * fStack_1d0;
      auVar145._12_4_ = fVar217 * fStack_1cc;
      auVar101._0_4_ = fVar214 * (float)local_1e8._0_4_;
      auVar101._4_4_ = fVar215 * (float)local_1e8._4_4_;
      auVar101._8_4_ = fVar216 * fStack_1e0;
      auVar101._12_4_ = fVar217 * fStack_1dc;
      auVar37 = vfmadd231ps_fma(auVar118,auVar50,local_178);
      auVar38 = vfmadd231ps_fma(auVar131,auVar50,local_188);
      auVar54 = vfmadd231ps_fma(auVar145,auVar50,local_198);
      auVar50 = vfmadd231ps_fma(auVar101,auVar50,local_1a8);
      auVar116._16_16_ = auVar37;
      auVar116._0_16_ = auVar37;
      auVar124._16_16_ = auVar38;
      auVar124._0_16_ = auVar38;
      auVar135._16_16_ = auVar54;
      auVar135._0_16_ = auVar54;
      auVar163._4_4_ = fVar213;
      auVar163._0_4_ = fVar213;
      auVar163._8_4_ = fVar213;
      auVar163._12_4_ = fVar213;
      auVar163._20_4_ = fVar201;
      auVar163._16_4_ = fVar201;
      auVar163._24_4_ = fVar201;
      auVar163._28_4_ = fVar201;
      auVar77 = vsubps_avx(auVar124,auVar116);
      auVar38 = vfmadd213ps_fma(auVar77,auVar163,auVar116);
      auVar77 = vsubps_avx(auVar135,auVar124);
      auVar55 = vfmadd213ps_fma(auVar77,auVar163,auVar124);
      auVar37 = vsubps_avx(auVar50,auVar54);
      auVar125._16_16_ = auVar37;
      auVar125._0_16_ = auVar37;
      auVar37 = vfmadd213ps_fma(auVar125,auVar163,auVar135);
      auVar77 = vsubps_avx(ZEXT1632(auVar55),ZEXT1632(auVar38));
      auVar50 = vfmadd213ps_fma(auVar77,auVar163,ZEXT1632(auVar38));
      auVar77 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar55));
      auVar37 = vfmadd213ps_fma(auVar77,auVar163,ZEXT1632(auVar55));
      auVar77 = vsubps_avx(ZEXT1632(auVar37),ZEXT1632(auVar50));
      auVar45 = vfmadd231ps_fma(ZEXT1632(auVar50),auVar77,auVar163);
      auVar77 = vmulps_avx512vl(auVar77,auVar252._0_32_);
      auVar37 = vmulss_avx512f(ZEXT416((uint)fVar218),SUB6416(ZEXT464(0x3eaaaaab),0));
      fVar201 = auVar37._0_4_;
      auVar146._0_8_ =
           CONCAT44(auVar45._4_4_ + fVar201 * auVar77._4_4_,auVar45._0_4_ + fVar201 * auVar77._0_4_)
      ;
      auVar146._8_4_ = auVar45._8_4_ + fVar201 * auVar77._8_4_;
      auVar146._12_4_ = auVar45._12_4_ + fVar201 * auVar77._12_4_;
      auVar119._0_4_ = fVar201 * auVar77._16_4_;
      auVar119._4_4_ = fVar201 * auVar77._20_4_;
      auVar119._8_4_ = fVar201 * auVar77._24_4_;
      auVar119._12_4_ = fVar201 * auVar77._28_4_;
      auVar43 = vsubps_avx((undefined1  [16])0x0,auVar119);
      auVar58 = vshufpd_avx(auVar45,auVar45,3);
      auVar35 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar37 = vsubps_avx(auVar58,auVar45);
      auVar50 = vsubps_avx(auVar35,(undefined1  [16])0x0);
      auVar168._0_4_ = auVar50._0_4_ + auVar37._0_4_;
      auVar168._4_4_ = auVar50._4_4_ + auVar37._4_4_;
      auVar168._8_4_ = auVar50._8_4_ + auVar37._8_4_;
      auVar168._12_4_ = auVar50._12_4_ + auVar37._12_4_;
      auVar37 = vshufps_avx(auVar45,auVar45,0xb1);
      auVar50 = vshufps_avx(auVar146,auVar146,0xb1);
      auVar38 = vshufps_avx(auVar43,auVar43,0xb1);
      auVar54 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar227._4_4_ = auVar168._0_4_;
      auVar227._0_4_ = auVar168._0_4_;
      auVar227._8_4_ = auVar168._0_4_;
      auVar227._12_4_ = auVar168._0_4_;
      auVar55 = vshufps_avx(auVar168,auVar168,0x55);
      fVar201 = auVar55._0_4_;
      auVar186._0_4_ = auVar37._0_4_ * fVar201;
      fVar213 = auVar55._4_4_;
      auVar186._4_4_ = auVar37._4_4_ * fVar213;
      fVar214 = auVar55._8_4_;
      auVar186._8_4_ = auVar37._8_4_ * fVar214;
      fVar215 = auVar55._12_4_;
      auVar186._12_4_ = auVar37._12_4_ * fVar215;
      auVar196._0_4_ = auVar50._0_4_ * fVar201;
      auVar196._4_4_ = auVar50._4_4_ * fVar213;
      auVar196._8_4_ = auVar50._8_4_ * fVar214;
      auVar196._12_4_ = auVar50._12_4_ * fVar215;
      auVar205._0_4_ = auVar38._0_4_ * fVar201;
      auVar205._4_4_ = auVar38._4_4_ * fVar213;
      auVar205._8_4_ = auVar38._8_4_ * fVar214;
      auVar205._12_4_ = auVar38._12_4_ * fVar215;
      auVar169._0_4_ = auVar54._0_4_ * fVar201;
      auVar169._4_4_ = auVar54._4_4_ * fVar213;
      auVar169._8_4_ = auVar54._8_4_ * fVar214;
      auVar169._12_4_ = auVar54._12_4_ * fVar215;
      auVar37 = vfmadd231ps_fma(auVar186,auVar227,auVar45);
      auVar50 = vfmadd231ps_fma(auVar196,auVar227,auVar146);
      auVar55 = vfmadd231ps_fma(auVar205,auVar227,auVar43);
      auVar44 = vfmadd231ps_fma(auVar169,(undefined1  [16])0x0,auVar227);
      auVar56 = vshufpd_avx(auVar37,auVar37,1);
      auVar57 = vshufpd_avx(auVar50,auVar50,1);
      auVar41 = vshufpd_avx(auVar55,auVar55,1);
      auVar42 = vshufpd_avx(auVar44,auVar44,1);
      auVar38 = vminss_avx(auVar37,auVar50);
      auVar37 = vmaxss_avx(auVar50,auVar37);
      auVar54 = vminss_avx(auVar55,auVar44);
      auVar50 = vmaxss_avx(auVar44,auVar55);
      auVar54 = vminss_avx(auVar38,auVar54);
      auVar37 = vmaxss_avx(auVar50,auVar37);
      auVar55 = vminss_avx(auVar56,auVar57);
      auVar50 = vmaxss_avx(auVar57,auVar56);
      auVar56 = vminss_avx(auVar41,auVar42);
      auVar38 = vmaxss_avx(auVar42,auVar41);
      auVar55 = vminss_avx(auVar55,auVar56);
      auVar50 = vmaxss_avx(auVar38,auVar50);
      vucomiss_avx512f(auVar54);
      if ((uVar30 < 5) || (auVar50 = vucomiss_avx512f(auVar40), uVar30 < 5)) {
        auVar37 = vucomiss_avx512f(auVar40);
        uVar14 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar15 = vcmpps_avx512vl(auVar54,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((4 < uVar30 & ((byte)uVar15 | (byte)uVar14)) != 0) goto LAB_01c1ebea;
        uVar14 = vcmpps_avx512vl(auVar40,auVar50,5);
        uVar15 = vcmpps_avx512vl(auVar55,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar15 | (ushort)uVar14) & 1) == 0) goto LAB_01c1ebea;
LAB_01c1f83d:
        bVar16 = true;
        auVar250 = ZEXT1664(auVar249);
      }
      else {
LAB_01c1ebea:
        uVar14 = vcmpss_avx512f(auVar54,auVar47,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        iVar91 = auVar256._0_4_;
        fVar201 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar91);
        uVar14 = vcmpss_avx512f(auVar37,auVar47,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        fVar213 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar91);
        bVar16 = fVar201 != fVar213;
        iVar257 = auVar258._0_4_;
        auVar77._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar80._4_28_ = auVar77._4_28_;
        auVar80._0_4_ = (uint)bVar16 * iVar257 + (uint)!bVar16 * 0x7f800000;
        auVar38 = auVar80._0_16_;
        auVar82._16_16_ = auVar77._16_16_;
        auVar82._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar81._4_28_ = auVar82._4_28_;
        auVar81._0_4_ = (uint)bVar16 * iVar257 + (uint)!bVar16 * -0x800000;
        auVar40 = auVar81._0_16_;
        uVar14 = vcmpss_avx512f(auVar55,auVar47,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        fVar214 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar91);
        if ((fVar201 != fVar214) || (NAN(fVar201) || NAN(fVar214))) {
          fVar215 = auVar55._0_4_;
          fVar201 = auVar54._0_4_;
          bVar16 = fVar215 == fVar201;
          if ((!bVar16) || (NAN(fVar215) || NAN(fVar201))) {
            auVar20._8_4_ = 0x80000000;
            auVar20._0_8_ = 0x8000000080000000;
            auVar20._12_4_ = 0x80000000;
            auVar54 = vxorps_avx512vl(auVar54,auVar20);
            auVar243._0_4_ = auVar54._0_4_ / (fVar215 - fVar201);
            auVar243._4_12_ = auVar54._4_12_;
            auVar54 = vsubss_avx512f(auVar51,auVar243);
            auVar55 = vfmadd213ss_avx512f(auVar54,auVar47,auVar243);
            auVar54 = auVar55;
          }
          else {
            vucomiss_avx512f(auVar47);
            auVar84._16_16_ = auVar77._16_16_;
            auVar84._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar83._4_28_ = auVar84._4_28_;
            auVar83._0_4_ = (uint)bVar16 * iVar257 + (uint)!bVar16 * 0x7f800000;
            auVar55 = auVar83._0_16_;
            auVar54 = ZEXT416((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * -0x800000);
          }
          auVar38 = vminss_avx(auVar38,auVar55);
          auVar40 = vmaxss_avx(auVar54,auVar40);
        }
        uVar14 = vcmpss_avx512f(auVar50,auVar47,1);
        bVar16 = (bool)((byte)uVar14 & 1);
        fVar201 = (float)((uint)bVar16 * -0x40800000 + (uint)!bVar16 * iVar91);
        if ((fVar213 != fVar201) || (NAN(fVar213) || NAN(fVar201))) {
          fVar215 = auVar50._0_4_;
          fVar213 = auVar37._0_4_;
          bVar16 = fVar215 == fVar213;
          if ((!bVar16) || (NAN(fVar215) || NAN(fVar213))) {
            auVar19._8_4_ = 0x80000000;
            auVar19._0_8_ = 0x8000000080000000;
            auVar19._12_4_ = 0x80000000;
            auVar37 = vxorps_avx512vl(auVar37,auVar19);
            auVar206._0_4_ = auVar37._0_4_ / (fVar215 - fVar213);
            auVar206._4_12_ = auVar37._4_12_;
            auVar37 = vsubss_avx512f(auVar51,auVar206);
            auVar50 = vfmadd213ss_avx512f(auVar37,auVar47,auVar206);
            auVar37 = auVar50;
          }
          else {
            vucomiss_avx512f(auVar47);
            auVar86._16_16_ = auVar77._16_16_;
            auVar86._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar85._4_28_ = auVar86._4_28_;
            auVar85._0_4_ = (uint)bVar16 * iVar257 + (uint)!bVar16 * 0x7f800000;
            auVar50 = auVar85._0_16_;
            auVar37 = ZEXT416((uint)bVar16 * 0x3f800000 + (uint)!bVar16 * -0x800000);
          }
          auVar38 = vminss_avx(auVar38,auVar50);
          auVar40 = vmaxss_avx(auVar37,auVar40);
        }
        bVar16 = fVar214 != fVar201;
        auVar37 = vminss_avx512f(auVar38,auVar51);
        auVar88._16_16_ = auVar77._16_16_;
        auVar88._0_16_ = auVar38;
        auVar87._4_28_ = auVar88._4_28_;
        auVar87._0_4_ = (uint)bVar16 * auVar37._0_4_ + (uint)!bVar16 * auVar38._0_4_;
        auVar37 = vmaxss_avx512f(auVar51,auVar40);
        auVar90._16_16_ = auVar77._16_16_;
        auVar90._0_16_ = auVar40;
        auVar89._4_28_ = auVar90._4_28_;
        auVar89._0_4_ = (uint)bVar16 * auVar37._0_4_ + (uint)!bVar16 * auVar40._0_4_;
        auVar40 = vmaxss_avx512f(auVar47,auVar87._0_16_);
        auVar37 = vminss_avx512f(auVar89._0_16_,auVar51);
        bVar16 = true;
        if (auVar37._0_4_ < auVar40._0_4_) goto LAB_01c1f83d;
        auVar57 = vmaxss_avx512f(auVar47,ZEXT416((uint)(auVar40._0_4_ + -0.1)));
        auVar41 = vminss_avx512f(ZEXT416((uint)(auVar37._0_4_ + 0.1)),auVar51);
        auVar102._0_8_ = auVar45._0_8_;
        auVar102._8_8_ = auVar102._0_8_;
        auVar197._8_8_ = auVar146._0_8_;
        auVar197._0_8_ = auVar146._0_8_;
        auVar207._8_8_ = auVar43._0_8_;
        auVar207._0_8_ = auVar43._0_8_;
        auVar40 = vshufpd_avx(auVar146,auVar146,3);
        auVar37 = vshufpd_avx(auVar43,auVar43,3);
        auVar50 = vshufps_avx(auVar57,auVar41,0);
        auVar228._8_4_ = 0x3f800000;
        auVar228._0_8_ = &DAT_3f8000003f800000;
        auVar228._12_4_ = 0x3f800000;
        auVar38 = vsubps_avx(auVar228,auVar50);
        fVar201 = auVar50._0_4_;
        auVar237._0_4_ = fVar201 * auVar58._0_4_;
        fVar213 = auVar50._4_4_;
        auVar237._4_4_ = fVar213 * auVar58._4_4_;
        fVar214 = auVar50._8_4_;
        auVar237._8_4_ = fVar214 * auVar58._8_4_;
        fVar215 = auVar50._12_4_;
        auVar237._12_4_ = fVar215 * auVar58._12_4_;
        auVar147._0_4_ = fVar201 * auVar40._0_4_;
        auVar147._4_4_ = fVar213 * auVar40._4_4_;
        auVar147._8_4_ = fVar214 * auVar40._8_4_;
        auVar147._12_4_ = fVar215 * auVar40._12_4_;
        auVar160._0_4_ = fVar201 * auVar37._0_4_;
        auVar160._4_4_ = fVar213 * auVar37._4_4_;
        auVar160._8_4_ = fVar214 * auVar37._8_4_;
        auVar160._12_4_ = fVar215 * auVar37._12_4_;
        auVar120._0_4_ = fVar201 * auVar35._0_4_;
        auVar120._4_4_ = fVar213 * auVar35._4_4_;
        auVar120._8_4_ = fVar214 * auVar35._8_4_;
        auVar120._12_4_ = fVar215 * auVar35._12_4_;
        auVar54 = vfmadd231ps_fma(auVar237,auVar38,auVar102);
        auVar55 = vfmadd231ps_fma(auVar147,auVar38,auVar197);
        auVar56 = vfmadd231ps_fma(auVar160,auVar38,auVar207);
        auVar58 = vfmadd231ps_fma(auVar120,auVar38,ZEXT816(0));
        auVar37 = vsubss_avx512f(auVar51,auVar57);
        auVar40 = vmovshdup_avx(auVar249);
        auVar44 = vfmadd231ss_fma(ZEXT416((uint)(auVar40._0_4_ * auVar57._0_4_)),auVar249,auVar37);
        auVar37 = vsubss_avx512f(auVar51,auVar41);
        auVar45 = vfmadd231ss_fma(ZEXT416((uint)(auVar41._0_4_ * auVar40._0_4_)),auVar249,auVar37);
        auVar35 = vdivss_avx512f(auVar51,ZEXT416((uint)fVar218));
        auVar40 = vsubps_avx(auVar55,auVar54);
        auVar50 = vmulps_avx512vl(auVar40,auVar39);
        auVar40 = vsubps_avx(auVar56,auVar55);
        auVar38 = vmulps_avx512vl(auVar40,auVar39);
        auVar40 = vsubps_avx(auVar58,auVar56);
        auVar40 = vmulps_avx512vl(auVar40,auVar39);
        auVar37 = vminps_avx(auVar38,auVar40);
        auVar40 = vmaxps_avx(auVar38,auVar40);
        auVar37 = vminps_avx(auVar50,auVar37);
        auVar40 = vmaxps_avx(auVar50,auVar40);
        auVar50 = vshufpd_avx(auVar37,auVar37,3);
        auVar38 = vshufpd_avx(auVar40,auVar40,3);
        auVar37 = vminps_avx(auVar37,auVar50);
        auVar40 = vmaxps_avx(auVar40,auVar38);
        fVar218 = auVar35._0_4_;
        auVar187._0_4_ = fVar218 * auVar37._0_4_;
        auVar187._4_4_ = fVar218 * auVar37._4_4_;
        auVar187._8_4_ = fVar218 * auVar37._8_4_;
        auVar187._12_4_ = fVar218 * auVar37._12_4_;
        auVar170._0_4_ = fVar218 * auVar40._0_4_;
        auVar170._4_4_ = fVar218 * auVar40._4_4_;
        auVar170._8_4_ = fVar218 * auVar40._8_4_;
        auVar170._12_4_ = fVar218 * auVar40._12_4_;
        auVar35 = vdivss_avx512f(auVar51,ZEXT416((uint)(auVar45._0_4_ - auVar44._0_4_)));
        auVar40 = vshufpd_avx(auVar54,auVar54,3);
        auVar37 = vshufpd_avx(auVar55,auVar55,3);
        auVar50 = vshufpd_avx(auVar56,auVar56,3);
        auVar38 = vshufpd_avx(auVar58,auVar58,3);
        auVar40 = vsubps_avx(auVar40,auVar54);
        auVar54 = vsubps_avx(auVar37,auVar55);
        auVar55 = vsubps_avx(auVar50,auVar56);
        auVar38 = vsubps_avx(auVar38,auVar58);
        auVar37 = vminps_avx(auVar40,auVar54);
        auVar40 = vmaxps_avx(auVar40,auVar54);
        auVar50 = vminps_avx(auVar55,auVar38);
        auVar50 = vminps_avx(auVar37,auVar50);
        auVar37 = vmaxps_avx(auVar55,auVar38);
        auVar40 = vmaxps_avx(auVar40,auVar37);
        fVar218 = auVar35._0_4_;
        auVar208._0_4_ = fVar218 * auVar50._0_4_;
        auVar208._4_4_ = fVar218 * auVar50._4_4_;
        auVar208._8_4_ = fVar218 * auVar50._8_4_;
        auVar208._12_4_ = fVar218 * auVar50._12_4_;
        auVar221._0_4_ = fVar218 * auVar40._0_4_;
        auVar221._4_4_ = fVar218 * auVar40._4_4_;
        auVar221._8_4_ = fVar218 * auVar40._8_4_;
        auVar221._12_4_ = fVar218 * auVar40._12_4_;
        in_ZMM31 = ZEXT1664(local_318);
        auVar43 = vinsertps_avx512f(local_318,auVar44,0x10);
        auVar54 = vinsertps_avx(auVar52,auVar45,0x10);
        auVar96._0_4_ = auVar43._0_4_ + auVar54._0_4_;
        auVar96._4_4_ = auVar43._4_4_ + auVar54._4_4_;
        auVar96._8_4_ = auVar43._8_4_ + auVar54._8_4_;
        auVar96._12_4_ = auVar43._12_4_ + auVar54._12_4_;
        auVar18._8_4_ = 0x3f000000;
        auVar18._0_8_ = 0x3f0000003f000000;
        auVar18._12_4_ = 0x3f000000;
        auVar41 = vmulps_avx512vl(auVar96,auVar18);
        auVar50 = vshufps_avx(auVar41,auVar41,0x54);
        uVar92 = auVar41._0_4_;
        auVar112._4_4_ = uVar92;
        auVar112._0_4_ = uVar92;
        auVar112._8_4_ = uVar92;
        auVar112._12_4_ = uVar92;
        auVar38 = vfmadd213ps_avx512vl(auVar255._0_16_,auVar112,auVar36);
        auVar55 = vfmadd213ps_avx512vl(local_c8,auVar112,auVar251._0_16_);
        auVar37 = vfmadd213ps_fma(local_d8,auVar112,local_2e8);
        auVar40 = vsubps_avx(auVar55,auVar38);
        auVar38 = vfmadd213ps_fma(auVar40,auVar112,auVar38);
        auVar40 = vsubps_avx(auVar37,auVar55);
        auVar40 = vfmadd213ps_fma(auVar40,auVar112,auVar55);
        auVar40 = vsubps_avx(auVar40,auVar38);
        auVar37 = vfmadd231ps_fma(auVar38,auVar40,auVar112);
        auVar56 = vmulps_avx512vl(auVar40,auVar39);
        auVar229._8_8_ = auVar37._0_8_;
        auVar229._0_8_ = auVar37._0_8_;
        auVar40 = vshufpd_avx(auVar37,auVar37,3);
        auVar37 = vshufps_avx(auVar41,auVar41,0x55);
        auVar38 = vsubps_avx(auVar40,auVar229);
        auVar55 = vfmadd231ps_fma(auVar229,auVar37,auVar38);
        auVar244._8_8_ = auVar56._0_8_;
        auVar244._0_8_ = auVar56._0_8_;
        auVar40 = vshufpd_avx(auVar56,auVar56,3);
        auVar40 = vsubps_avx(auVar40,auVar244);
        auVar37 = vfmadd213ps_fma(auVar40,auVar37,auVar244);
        auVar113._0_8_ = auVar38._0_8_ ^ 0x8000000080000000;
        auVar113._8_4_ = auVar38._8_4_ ^ 0x80000000;
        auVar113._12_4_ = auVar38._12_4_ ^ 0x80000000;
        auVar40 = vmovshdup_avx(auVar37);
        auVar245._0_8_ = auVar40._0_8_ ^ 0x8000000080000000;
        auVar245._8_4_ = auVar40._8_4_ ^ 0x80000000;
        auVar245._12_4_ = auVar40._12_4_ ^ 0x80000000;
        auVar56 = vmovshdup_avx512vl(auVar38);
        auVar58 = vpermt2ps_avx512vl(auVar245,ZEXT416(5),auVar38);
        auVar40 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar40._0_4_ * auVar38._0_4_)),auVar37,auVar56
                                     );
        auVar37 = vpermt2ps_avx512vl(auVar37,SUB6416(ZEXT464(4),0),auVar113);
        auVar121._0_4_ = auVar40._0_4_;
        auVar121._4_4_ = auVar121._0_4_;
        auVar121._8_4_ = auVar121._0_4_;
        auVar121._12_4_ = auVar121._0_4_;
        auVar40 = vdivps_avx(auVar58,auVar121);
        auVar37 = vdivps_avx(auVar37,auVar121);
        fVar201 = auVar55._0_4_;
        auVar38 = vshufps_avx(auVar55,auVar55,0x55);
        fVar218 = auVar37._0_4_;
        auVar230._0_4_ = fVar201 * auVar40._0_4_ + auVar38._0_4_ * fVar218;
        auVar230._4_4_ = fVar201 * auVar40._4_4_ + auVar38._4_4_ * auVar37._4_4_;
        auVar230._8_4_ = fVar201 * auVar40._8_4_ + auVar38._8_4_ * auVar37._8_4_;
        auVar230._12_4_ = fVar201 * auVar40._12_4_ + auVar38._12_4_ * auVar37._12_4_;
        auVar42 = vsubps_avx(auVar50,auVar230);
        auVar55 = vmovshdup_avx(auVar40);
        auVar50 = vinsertps_avx(auVar187,auVar208,0x1c);
        auVar246._0_4_ = auVar55._0_4_ * auVar50._0_4_;
        auVar246._4_4_ = auVar55._4_4_ * auVar50._4_4_;
        auVar246._8_4_ = auVar55._8_4_ * auVar50._8_4_;
        auVar246._12_4_ = auVar55._12_4_ * auVar50._12_4_;
        auVar38 = vinsertps_avx(auVar170,auVar221,0x1c);
        auVar231._0_4_ = auVar55._0_4_ * auVar38._0_4_;
        auVar231._4_4_ = auVar55._4_4_ * auVar38._4_4_;
        auVar231._8_4_ = auVar55._8_4_ * auVar38._8_4_;
        auVar231._12_4_ = auVar55._12_4_ * auVar38._12_4_;
        auVar57 = vminps_avx512vl(auVar246,auVar231);
        auVar58 = vmaxps_avx(auVar231,auVar246);
        auVar35 = vmovshdup_avx(auVar37);
        auVar55 = vinsertps_avx(auVar208,auVar187,0x4c);
        auVar209._0_4_ = auVar35._0_4_ * auVar55._0_4_;
        auVar209._4_4_ = auVar35._4_4_ * auVar55._4_4_;
        auVar209._8_4_ = auVar35._8_4_ * auVar55._8_4_;
        auVar209._12_4_ = auVar35._12_4_ * auVar55._12_4_;
        auVar56 = vinsertps_avx(auVar221,auVar170,0x4c);
        auVar222._0_4_ = auVar35._0_4_ * auVar56._0_4_;
        auVar222._4_4_ = auVar35._4_4_ * auVar56._4_4_;
        auVar222._8_4_ = auVar35._8_4_ * auVar56._8_4_;
        auVar222._12_4_ = auVar35._12_4_ * auVar56._12_4_;
        auVar35 = vminps_avx(auVar209,auVar222);
        auVar57 = vaddps_avx512vl(auVar57,auVar35);
        auVar35 = vmaxps_avx(auVar222,auVar209);
        auVar210._0_4_ = auVar58._0_4_ + auVar35._0_4_;
        auVar210._4_4_ = auVar58._4_4_ + auVar35._4_4_;
        auVar210._8_4_ = auVar58._8_4_ + auVar35._8_4_;
        auVar210._12_4_ = auVar58._12_4_ + auVar35._12_4_;
        auVar223._8_8_ = 0x3f80000000000000;
        auVar223._0_8_ = 0x3f80000000000000;
        auVar58 = vsubps_avx(auVar223,auVar210);
        auVar35 = vsubps_avx(auVar223,auVar57);
        auVar57 = vsubps_avx(auVar43,auVar41);
        auVar41 = vsubps_avx(auVar54,auVar41);
        fVar216 = auVar57._0_4_;
        auVar247._0_4_ = fVar216 * auVar58._0_4_;
        fVar217 = auVar57._4_4_;
        auVar247._4_4_ = fVar217 * auVar58._4_4_;
        fVar164 = auVar57._8_4_;
        auVar247._8_4_ = fVar164 * auVar58._8_4_;
        fVar178 = auVar57._12_4_;
        auVar247._12_4_ = fVar178 * auVar58._12_4_;
        auVar46 = vbroadcastss_avx512vl(auVar40);
        auVar50 = vmulps_avx512vl(auVar46,auVar50);
        auVar38 = vmulps_avx512vl(auVar46,auVar38);
        auVar46 = vminps_avx512vl(auVar50,auVar38);
        auVar50 = vmaxps_avx(auVar38,auVar50);
        auVar188._0_4_ = fVar218 * auVar55._0_4_;
        auVar188._4_4_ = fVar218 * auVar55._4_4_;
        auVar188._8_4_ = fVar218 * auVar55._8_4_;
        auVar188._12_4_ = fVar218 * auVar55._12_4_;
        auVar171._0_4_ = fVar218 * auVar56._0_4_;
        auVar171._4_4_ = fVar218 * auVar56._4_4_;
        auVar171._8_4_ = fVar218 * auVar56._8_4_;
        auVar171._12_4_ = fVar218 * auVar56._12_4_;
        auVar38 = vminps_avx(auVar188,auVar171);
        auVar55 = vaddps_avx512vl(auVar46,auVar38);
        auVar56 = vmulps_avx512vl(auVar57,auVar35);
        fVar201 = auVar41._0_4_;
        auVar211._0_4_ = fVar201 * auVar58._0_4_;
        fVar213 = auVar41._4_4_;
        auVar211._4_4_ = fVar213 * auVar58._4_4_;
        fVar214 = auVar41._8_4_;
        auVar211._8_4_ = fVar214 * auVar58._8_4_;
        fVar215 = auVar41._12_4_;
        auVar211._12_4_ = fVar215 * auVar58._12_4_;
        auVar224._0_4_ = fVar201 * auVar35._0_4_;
        auVar224._4_4_ = fVar213 * auVar35._4_4_;
        auVar224._8_4_ = fVar214 * auVar35._8_4_;
        auVar224._12_4_ = fVar215 * auVar35._12_4_;
        auVar38 = vmaxps_avx(auVar171,auVar188);
        auVar172._0_4_ = auVar50._0_4_ + auVar38._0_4_;
        auVar172._4_4_ = auVar50._4_4_ + auVar38._4_4_;
        auVar172._8_4_ = auVar50._8_4_ + auVar38._8_4_;
        auVar172._12_4_ = auVar50._12_4_ + auVar38._12_4_;
        auVar189._8_8_ = 0x3f800000;
        auVar189._0_8_ = 0x3f800000;
        auVar50 = vsubps_avx(auVar189,auVar172);
        auVar38 = vsubps_avx(auVar189,auVar55);
        auVar238._0_4_ = fVar216 * auVar50._0_4_;
        auVar238._4_4_ = fVar217 * auVar50._4_4_;
        auVar238._8_4_ = fVar164 * auVar50._8_4_;
        auVar238._12_4_ = fVar178 * auVar50._12_4_;
        auVar232._0_4_ = fVar216 * auVar38._0_4_;
        auVar232._4_4_ = fVar217 * auVar38._4_4_;
        auVar232._8_4_ = fVar164 * auVar38._8_4_;
        auVar232._12_4_ = fVar178 * auVar38._12_4_;
        auVar173._0_4_ = fVar201 * auVar50._0_4_;
        auVar173._4_4_ = fVar213 * auVar50._4_4_;
        auVar173._8_4_ = fVar214 * auVar50._8_4_;
        auVar173._12_4_ = fVar215 * auVar50._12_4_;
        auVar190._0_4_ = fVar201 * auVar38._0_4_;
        auVar190._4_4_ = fVar213 * auVar38._4_4_;
        auVar190._8_4_ = fVar214 * auVar38._8_4_;
        auVar190._12_4_ = fVar215 * auVar38._12_4_;
        auVar50 = vminps_avx(auVar238,auVar232);
        auVar38 = vminps_avx(auVar173,auVar190);
        auVar55 = vminps_avx(auVar50,auVar38);
        auVar50 = vmaxps_avx(auVar232,auVar238);
        auVar38 = vmaxps_avx(auVar190,auVar173);
        auVar38 = vmaxps_avx(auVar38,auVar50);
        auVar58 = vminps_avx512vl(auVar247,auVar56);
        auVar50 = vminps_avx(auVar211,auVar224);
        auVar50 = vminps_avx(auVar58,auVar50);
        auVar50 = vhaddps_avx(auVar55,auVar50);
        auVar56 = vmaxps_avx512vl(auVar56,auVar247);
        auVar55 = vmaxps_avx(auVar224,auVar211);
        auVar55 = vmaxps_avx(auVar55,auVar56);
        auVar38 = vhaddps_avx(auVar38,auVar55);
        auVar50 = vshufps_avx(auVar50,auVar50,0xe8);
        auVar38 = vshufps_avx(auVar38,auVar38,0xe8);
        auVar174._0_4_ = auVar50._0_4_ + auVar42._0_4_;
        auVar174._4_4_ = auVar50._4_4_ + auVar42._4_4_;
        auVar174._8_4_ = auVar50._8_4_ + auVar42._8_4_;
        auVar174._12_4_ = auVar50._12_4_ + auVar42._12_4_;
        auVar191._0_4_ = auVar38._0_4_ + auVar42._0_4_;
        auVar191._4_4_ = auVar38._4_4_ + auVar42._4_4_;
        auVar191._8_4_ = auVar38._8_4_ + auVar42._8_4_;
        auVar191._12_4_ = auVar38._12_4_ + auVar42._12_4_;
        auVar50 = vmaxps_avx(auVar43,auVar174);
        auVar38 = vminps_avx(auVar191,auVar54);
        uVar27 = vcmpps_avx512vl(auVar38,auVar50,1);
        local_2f8 = vinsertps_avx(auVar44,auVar45,0x10);
        auVar250 = ZEXT1664(local_2f8);
        if ((uVar27 & 3) == 0) {
          vucomiss_avx512f(local_318);
          auVar251 = ZEXT1664(local_328);
          if (uVar30 < 4 && (uVar6 == 0 || lVar29 == 0)) {
            bVar16 = false;
          }
          else {
            lVar29 = 200;
            do {
              auVar50 = vsubss_avx512f(auVar51,auVar42);
              fVar214 = auVar50._0_4_;
              fVar201 = fVar214 * fVar214 * fVar214;
              fVar215 = auVar42._0_4_;
              fVar213 = fVar215 * 3.0 * fVar214 * fVar214;
              fVar214 = fVar214 * fVar215 * fVar215 * 3.0;
              auVar148._4_4_ = fVar201;
              auVar148._0_4_ = fVar201;
              auVar148._8_4_ = fVar201;
              auVar148._12_4_ = fVar201;
              auVar132._4_4_ = fVar213;
              auVar132._0_4_ = fVar213;
              auVar132._8_4_ = fVar213;
              auVar132._12_4_ = fVar213;
              auVar103._4_4_ = fVar214;
              auVar103._0_4_ = fVar214;
              auVar103._8_4_ = fVar214;
              auVar103._12_4_ = fVar214;
              fVar215 = fVar215 * fVar215 * fVar215;
              auVar161._0_4_ = (float)local_1f8._0_4_ * fVar215;
              auVar161._4_4_ = (float)local_1f8._4_4_ * fVar215;
              auVar161._8_4_ = fStack_1f0 * fVar215;
              auVar161._12_4_ = fStack_1ec * fVar215;
              auVar50 = vfmadd231ps_fma(auVar161,local_2e8,auVar103);
              auVar50 = vfmadd231ps_avx512vl(auVar50,local_328,auVar132);
              auVar50 = vfmadd231ps_avx512vl(auVar50,auVar36,auVar148);
              auVar104._8_8_ = auVar50._0_8_;
              auVar104._0_8_ = auVar50._0_8_;
              auVar50 = vshufpd_avx(auVar50,auVar50,3);
              auVar38 = vshufps_avx(auVar42,auVar42,0x55);
              auVar50 = vsubps_avx(auVar50,auVar104);
              auVar38 = vfmadd213ps_fma(auVar50,auVar38,auVar104);
              fVar201 = auVar38._0_4_;
              auVar50 = vshufps_avx(auVar38,auVar38,0x55);
              auVar105._0_4_ = auVar40._0_4_ * fVar201 + fVar218 * auVar50._0_4_;
              auVar105._4_4_ = auVar40._4_4_ * fVar201 + auVar37._4_4_ * auVar50._4_4_;
              auVar105._8_4_ = auVar40._8_4_ * fVar201 + auVar37._8_4_ * auVar50._8_4_;
              auVar105._12_4_ = auVar40._12_4_ * fVar201 + auVar37._12_4_ * auVar50._12_4_;
              auVar42 = vsubps_avx(auVar42,auVar105);
              auVar50 = vandps_avx512vl(auVar38,auVar254._0_16_);
              auVar38 = vprolq_avx512vl(auVar50,0x20);
              auVar50 = vmaxss_avx(auVar38,auVar50);
              bVar13 = auVar50._0_4_ <= (float)local_208._0_4_;
              if (auVar50._0_4_ < (float)local_208._0_4_) {
                auVar40 = vucomiss_avx512f(auVar47);
                if (bVar13) {
                  auVar37 = vucomiss_avx512f(auVar40);
                  auVar256 = ZEXT1664(auVar37);
                  if (bVar13) {
                    vmovshdup_avx(auVar40);
                    auVar37 = vucomiss_avx512f(auVar47);
                    if (bVar13) {
                      auVar50 = vucomiss_avx512f(auVar37);
                      auVar256 = ZEXT1664(auVar50);
                      if (bVar13) {
                        auVar51 = vinsertps_avx(ZEXT416((uint)(pre->ray_space).vx.field_0.m128[2]),
                                                ZEXT416((uint)(pre->ray_space).vy.field_0.m128[2]),
                                                0x1c);
                        auVar57 = vinsertps_avx(auVar51,ZEXT416((uint)(pre->ray_space).vz.field_0.
                                                                      m128[2]),0x28);
                        aVar2 = (ray->org).field_0;
                        auVar51 = vsubps_avx(local_218,(undefined1  [16])aVar2);
                        auVar51 = vdpps_avx(auVar51,auVar57,0x7f);
                        auVar38 = vsubps_avx(local_228,(undefined1  [16])aVar2);
                        auVar38 = vdpps_avx(auVar38,auVar57,0x7f);
                        auVar54 = vsubps_avx(local_238,(undefined1  [16])aVar2);
                        auVar54 = vdpps_avx(auVar54,auVar57,0x7f);
                        auVar55 = vsubps_avx(local_248,(undefined1  [16])aVar2);
                        auVar55 = vdpps_avx(auVar55,auVar57,0x7f);
                        auVar56 = vsubps_avx(_local_258,(undefined1  [16])aVar2);
                        auVar56 = vdpps_avx(auVar56,auVar57,0x7f);
                        auVar58 = vsubps_avx(_local_268,(undefined1  [16])aVar2);
                        auVar58 = vdpps_avx(auVar58,auVar57,0x7f);
                        auVar35 = vsubps_avx(_local_278,(undefined1  [16])aVar2);
                        auVar35 = vdpps_avx(auVar35,auVar57,0x7f);
                        auVar41 = vsubps_avx(_local_288,(undefined1  [16])aVar2);
                        auVar57 = vdpps_avx(auVar41,auVar57,0x7f);
                        auVar41 = vsubss_avx512f(auVar50,auVar37);
                        fVar218 = auVar37._0_4_;
                        auVar37 = vfmadd231ss_fma(ZEXT416((uint)(auVar56._0_4_ * fVar218)),auVar41,
                                                  auVar51);
                        auVar51 = vfmadd231ss_fma(ZEXT416((uint)(auVar58._0_4_ * fVar218)),auVar41,
                                                  auVar38);
                        auVar38 = vfmadd231ss_fma(ZEXT416((uint)(auVar35._0_4_ * fVar218)),auVar41,
                                                  auVar54);
                        auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar218 * auVar57._0_4_)),auVar41,
                                                  auVar55);
                        auVar50 = vsubss_avx512f(auVar50,auVar40);
                        auVar162._0_4_ = auVar50._0_4_;
                        fVar218 = auVar162._0_4_ * auVar162._0_4_ * auVar162._0_4_;
                        fVar214 = auVar40._0_4_;
                        fVar201 = fVar214 * 3.0 * auVar162._0_4_ * auVar162._0_4_;
                        fVar213 = auVar162._0_4_ * fVar214 * fVar214 * 3.0;
                        fVar216 = fVar214 * fVar214 * fVar214;
                        auVar50 = vfmadd231ss_fma(ZEXT416((uint)(fVar216 * auVar54._0_4_)),
                                                  ZEXT416((uint)fVar213),auVar38);
                        auVar50 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar201),auVar51);
                        auVar37 = vfmadd231ss_fma(auVar50,ZEXT416((uint)fVar218),auVar37);
                        fVar215 = auVar37._0_4_;
                        if (((ray->org).field_0.m128[3] <= fVar215) &&
                           (fVar217 = ray->tfar, fVar215 <= fVar217)) {
                          auVar37 = vshufps_avx(auVar40,auVar40,0x55);
                          auVar192._8_4_ = 0x3f800000;
                          auVar192._0_8_ = &DAT_3f8000003f800000;
                          auVar192._12_4_ = 0x3f800000;
                          auVar50 = vsubps_avx(auVar192,auVar37);
                          fVar164 = auVar37._0_4_;
                          auVar198._0_4_ = fVar164 * (float)local_258._0_4_;
                          fVar178 = auVar37._4_4_;
                          auVar198._4_4_ = fVar178 * (float)local_258._4_4_;
                          fVar179 = auVar37._8_4_;
                          auVar198._8_4_ = fVar179 * fStack_250;
                          fVar180 = auVar37._12_4_;
                          auVar198._12_4_ = fVar180 * fStack_24c;
                          auVar212._0_4_ = fVar164 * (float)local_268._0_4_;
                          auVar212._4_4_ = fVar178 * (float)local_268._4_4_;
                          auVar212._8_4_ = fVar179 * fStack_260;
                          auVar212._12_4_ = fVar180 * fStack_25c;
                          auVar225._0_4_ = fVar164 * (float)local_278._0_4_;
                          auVar225._4_4_ = fVar178 * (float)local_278._4_4_;
                          auVar225._8_4_ = fVar179 * fStack_270;
                          auVar225._12_4_ = fVar180 * fStack_26c;
                          auVar175._0_4_ = fVar164 * (float)local_288._0_4_;
                          auVar175._4_4_ = fVar178 * (float)local_288._4_4_;
                          auVar175._8_4_ = fVar179 * fStack_280;
                          auVar175._12_4_ = fVar180 * fStack_27c;
                          auVar37 = vfmadd231ps_fma(auVar198,auVar50,local_218);
                          auVar51 = vfmadd231ps_fma(auVar212,auVar50,local_228);
                          auVar38 = vfmadd231ps_fma(auVar225,auVar50,local_238);
                          auVar54 = vfmadd231ps_fma(auVar175,auVar50,local_248);
                          auVar37 = vsubps_avx(auVar51,auVar37);
                          auVar50 = vsubps_avx(auVar38,auVar51);
                          auVar51 = vsubps_avx(auVar54,auVar38);
                          auVar226._0_4_ = fVar214 * auVar50._0_4_;
                          auVar226._4_4_ = fVar214 * auVar50._4_4_;
                          auVar226._8_4_ = fVar214 * auVar50._8_4_;
                          auVar226._12_4_ = fVar214 * auVar50._12_4_;
                          auVar162._4_4_ = auVar162._0_4_;
                          auVar162._8_4_ = auVar162._0_4_;
                          auVar162._12_4_ = auVar162._0_4_;
                          auVar37 = vfmadd231ps_fma(auVar226,auVar162,auVar37);
                          auVar176._0_4_ = fVar214 * auVar51._0_4_;
                          auVar176._4_4_ = fVar214 * auVar51._4_4_;
                          auVar176._8_4_ = fVar214 * auVar51._8_4_;
                          auVar176._12_4_ = fVar214 * auVar51._12_4_;
                          auVar50 = vfmadd231ps_fma(auVar176,auVar162,auVar50);
                          auVar177._0_4_ = fVar214 * auVar50._0_4_;
                          auVar177._4_4_ = fVar214 * auVar50._4_4_;
                          auVar177._8_4_ = fVar214 * auVar50._8_4_;
                          auVar177._12_4_ = fVar214 * auVar50._12_4_;
                          auVar37 = vfmadd231ps_fma(auVar177,auVar162,auVar37);
                          auVar39 = vmulps_avx512vl(auVar37,auVar39);
                          pGVar7 = (context->scene->geometries).items[uVar32].ptr;
                          if ((pGVar7->mask & ray->mask) == 0) {
                            bVar13 = false;
                          }
                          else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                  (bVar13 = true,
                                  pGVar7->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                            auVar149._0_4_ = fVar216 * (float)local_128._0_4_;
                            auVar149._4_4_ = fVar216 * (float)local_128._4_4_;
                            auVar149._8_4_ = fVar216 * fStack_120;
                            auVar149._12_4_ = fVar216 * fStack_11c;
                            auVar133._4_4_ = fVar213;
                            auVar133._0_4_ = fVar213;
                            auVar133._8_4_ = fVar213;
                            auVar133._12_4_ = fVar213;
                            auVar37 = vfmadd132ps_fma(auVar133,auVar149,local_118);
                            auVar122._4_4_ = fVar201;
                            auVar122._0_4_ = fVar201;
                            auVar122._8_4_ = fVar201;
                            auVar122._12_4_ = fVar201;
                            auVar37 = vfmadd132ps_fma(auVar122,auVar37,local_108);
                            auVar114._4_4_ = fVar218;
                            auVar114._0_4_ = fVar218;
                            auVar114._8_4_ = fVar218;
                            auVar114._12_4_ = fVar218;
                            auVar51 = vfmadd132ps_fma(auVar114,auVar37,local_f8);
                            auVar37 = vshufps_avx(auVar51,auVar51,0xc9);
                            auVar50 = vshufps_avx(auVar39,auVar39,0xc9);
                            auVar115._0_4_ = auVar51._0_4_ * auVar50._0_4_;
                            auVar115._4_4_ = auVar51._4_4_ * auVar50._4_4_;
                            auVar115._8_4_ = auVar51._8_4_ * auVar50._8_4_;
                            auVar115._12_4_ = auVar51._12_4_ * auVar50._12_4_;
                            auVar37 = vfmsub231ps_fma(auVar115,auVar39,auVar37);
                            auVar39 = vshufps_avx(auVar37,auVar37,0xe9);
                            local_158 = vmovlps_avx(auVar39);
                            local_150 = auVar37._0_4_;
                            local_14c = vmovlps_avx(auVar40);
                            local_144 = (int)local_2c8;
                            local_140 = uVar32;
                            local_13c = context->user->instID[0];
                            local_138 = context->user->instPrimID[0];
                            ray->tfar = fVar215;
                            local_32c = -1;
                            local_2b8.valid = &local_32c;
                            local_2b8.geometryUserPtr = pGVar7->userPtr;
                            local_2b8.context = context->user;
                            local_2b8.hit = (RTCHitN *)&local_158;
                            local_2b8.N = 1;
                            local_2b8.ray = (RTCRayN *)ray;
                            if (pGVar7->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01c1f705:
                              auVar39 = auVar258._0_16_;
                              p_Var12 = context->args->filter;
                              if (p_Var12 != (RTCFilterFunctionN)0x0) {
                                if (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                                   (((pGVar7->field_8).field_0x2 & 0x40) != 0)) {
                                  (*p_Var12)(&local_2b8);
                                  auVar250 = ZEXT1664(local_2f8);
                                  auVar255 = ZEXT1664(local_308);
                                  auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar252 = ZEXT3264(auVar77);
                                  auVar251 = ZEXT1664(local_328);
                                  auVar256 = ZEXT464(0x3f800000);
                                  auVar40 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar253 = ZEXT1664(auVar40);
                                  auVar39 = vxorps_avx512vl(auVar39,auVar39);
                                  auVar258 = ZEXT1664(auVar39);
                                  auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar254 = ZEXT1664(auVar39);
                                }
                                if (*local_2b8.valid == 0) goto LAB_01c1f848;
                              }
                              bVar13 = true;
                            }
                            else {
                              local_2d0 = lVar31;
                              (*pGVar7->occlusionFilterN)(&local_2b8);
                              auVar250 = ZEXT1664(local_2f8);
                              auVar255 = ZEXT1664(local_308);
                              auVar77 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar252 = ZEXT3264(auVar77);
                              auVar251 = ZEXT1664(local_328);
                              auVar256 = ZEXT464(0x3f800000);
                              auVar39 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                              auVar253 = ZEXT1664(auVar39);
                              auVar39 = vxorps_avx512vl(auVar47,auVar47);
                              auVar258 = ZEXT1664(auVar39);
                              auVar39 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                              auVar254 = ZEXT1664(auVar39);
                              lVar31 = local_2d0;
                              if (*local_2b8.valid != 0) goto LAB_01c1f705;
LAB_01c1f848:
                              bVar13 = false;
                            }
                            if (!bVar13) {
                              ray->tfar = fVar217;
                            }
                          }
                          bVar33 = (bool)(bVar33 | bVar13);
                        }
                      }
                    }
                  }
                }
                break;
              }
              lVar29 = lVar29 + -1;
            } while (lVar29 != 0);
          }
        }
        else {
          auVar251 = ZEXT1664(local_328);
        }
      }
    } while (bVar16);
    auVar39 = vinsertps_avx(local_318,auVar52,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }